

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitors.c
# Opt level: O3

void test_modes(GLFWmonitor *monitor)

{
  GLFWvidmode *pGVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  GLFWmonitor *monitor_00;
  GLFWwindow *handle;
  GLubyte *pGVar5;
  size_t sVar6;
  char **exts_i;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  GLFWvidmode *mode;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  double dVar15;
  int major;
  int count;
  GLFWvidmode current;
  uint local_84;
  int local_80;
  int local_7c;
  GLFWwindow *local_78;
  int local_6c;
  int local_68;
  int local_64;
  uint local_60;
  uint local_5c;
  uint local_58 [2];
  ulong local_50;
  GLFWvidmode *local_48;
  GLFWmonitor *local_40;
  GLFWvidmode *local_38;
  
  local_40 = monitor;
  local_48 = glfwGetVideoModes(monitor,&local_6c);
  if (0 < local_6c) {
    uVar13 = 0;
    do {
      pGVar1 = local_48;
      mode = local_48 + uVar13;
      glfwWindowHint(0x21001,local_48[uVar13].redBits);
      glfwWindowHint(0x21002,pGVar1[uVar13].greenBits);
      glfwWindowHint(0x21003,pGVar1[uVar13].blueBits);
      glfwWindowHint(0x2100f,pGVar1[uVar13].refreshRate);
      pcVar4 = glfwGetMonitorName(local_40);
      format_mode(mode);
      printf("Testing mode %u on monitor %s: %s\n",uVar13 & 0xffffffff,pcVar4,format_mode::buffer);
      iVar2 = pGVar1[uVar13].width;
      iVar3 = pGVar1[uVar13].height;
      monitor_00 = glfwGetPrimaryMonitor();
      handle = glfwCreateWindow(iVar2,iVar3,"Video Mode Test",monitor_00,(GLFWwindow *)0x0);
      if (handle == (GLFWwindow *)0x0) {
        format_mode(mode);
        printf("Failed to enter mode %u: %s\n",uVar13 & 0xffffffff,format_mode::buffer);
      }
      else {
        local_38 = mode;
        glfwSetFramebufferSizeCallback(handle,framebuffer_size_callback);
        glfwSetKeyCallback(handle,key_callback);
        glfwMakeContextCurrent(handle);
        glad_glGetString = (PFNGLGETSTRINGPROC)glfwGetProcAddress("glGetString");
        if ((glad_glGetString != (PFNGLGETSTRINGPROC)0x0) &&
           (pGVar5 = (*glad_glGetString)(0x1f02), pGVar5 != (GLubyte *)0x0)) {
          local_84 = 0;
          local_7c = 0;
          pGVar5 = (*glad_glGetString)(0x1f02);
          local_50 = uVar13;
          if (pGVar5 == (GLubyte *)0x0) {
            iVar2 = 0;
          }
          else {
            lVar12 = 0;
            local_78 = handle;
            do {
              pcVar4 = *(char **)((long)&PTR_anon_var_dwarf_66e4_001510e0 + lVar12);
              sVar6 = strlen(pcVar4);
              iVar2 = strncmp((char *)pGVar5,pcVar4,sVar6);
              if (iVar2 == 0) {
                pGVar5 = pGVar5 + sVar6;
                break;
              }
              lVar12 = lVar12 + 8;
            } while (lVar12 != 0x20);
            __isoc99_sscanf(pGVar5,"%d.%d",&local_84,&local_7c);
            local_80 = local_7c;
            bVar14 = 1 < (int)local_84;
            GLAD_GL_VERSION_1_4 = (int)bVar14;
            uVar11 = (uint)bVar14;
            uVar8 = (uint)(3 < (int)local_84);
            uVar7 = (uint)bVar14;
            GLAD_GL_VERSION_3_3 = uVar8;
            GLAD_GL_VERSION_1_3 = uVar11;
            if (2 < local_7c) {
              GLAD_GL_VERSION_1_3 = 1;
              GLAD_GL_VERSION_3_3 = 1;
            }
            if (local_84 != 3) {
              GLAD_GL_VERSION_3_3 = uVar8;
            }
            GLAD_GL_VERSION_3_2 = uVar8;
            GLAD_GL_VERSION_1_2 = uVar11;
            if (1 < local_7c) {
              GLAD_GL_VERSION_1_2 = 1;
              GLAD_GL_VERSION_3_2 = 1;
            }
            uVar10 = (uint)(2 < (int)local_84);
            if (local_84 != 3) {
              GLAD_GL_VERSION_3_2 = uVar8;
            }
            bVar14 = -1 < local_7c;
            GLAD_GL_VERSION_1_0 = uVar11;
            if (bVar14) {
              GLAD_GL_VERSION_1_0 = 1;
            }
            GLAD_GL_VERSION_1_1 = GLAD_GL_VERSION_1_4;
            if (0 < local_7c) {
              GLAD_GL_VERSION_1_1 = 1;
            }
            GLAD_GL_VERSION_2_0 = uVar10;
            if (bVar14) {
              GLAD_GL_VERSION_2_0 = 1;
            }
            GLAD_GL_VERSION_2_1 = uVar10;
            if (0 < local_7c) {
              GLAD_GL_VERSION_2_1 = 1;
            }
            GLAD_GL_VERSION_3_0 = uVar8;
            if (bVar14) {
              GLAD_GL_VERSION_3_0 = 1;
            }
            GLAD_GL_VERSION_3_1 = uVar8;
            if (0 < local_7c) {
              GLAD_GL_VERSION_3_1 = 1;
            }
            if (local_84 != 3) {
              GLAD_GL_VERSION_3_1 = uVar8;
              GLAD_GL_VERSION_3_0 = uVar8;
            }
            if (local_84 != 2) {
              GLAD_GL_VERSION_2_1 = uVar10;
              GLAD_GL_VERSION_2_0 = uVar10;
            }
            if (3 < local_7c) {
              GLAD_GL_VERSION_1_4 = 1;
            }
            GLAD_GL_VERSION_1_5 = uVar11;
            if (4 < local_7c) {
              GLAD_GL_VERSION_1_5 = 1;
            }
            if (local_84 != 1) {
              GLAD_GL_VERSION_1_5 = uVar7;
              GLAD_GL_VERSION_1_3 = uVar7;
              GLAD_GL_VERSION_1_4 = uVar11;
              GLAD_GL_VERSION_1_1 = uVar11;
              GLAD_GL_VERSION_1_2 = uVar7;
              GLAD_GL_VERSION_1_0 = uVar7;
            }
            iVar2 = local_84 * 10000 + local_7c;
            handle = local_78;
          }
          uVar13 = local_50;
          if (GLAD_GL_VERSION_1_0 != 0) {
            glad_glAccum = (PFNGLACCUMPROC)glfwGetProcAddress("glAccum");
            glad_glAlphaFunc = (PFNGLALPHAFUNCPROC)glfwGetProcAddress("glAlphaFunc");
            glad_glBegin = (PFNGLBEGINPROC)glfwGetProcAddress("glBegin");
            glad_glBitmap = (PFNGLBITMAPPROC)glfwGetProcAddress("glBitmap");
            glad_glBlendFunc = (PFNGLBLENDFUNCPROC)glfwGetProcAddress("glBlendFunc");
            glad_glCallList = (PFNGLCALLLISTPROC)glfwGetProcAddress("glCallList");
            glad_glCallLists = (PFNGLCALLLISTSPROC)glfwGetProcAddress("glCallLists");
            glad_glClear = (PFNGLCLEARPROC)glfwGetProcAddress("glClear");
            glad_glClearAccum = (PFNGLCLEARACCUMPROC)glfwGetProcAddress("glClearAccum");
            glad_glClearColor = (PFNGLCLEARCOLORPROC)glfwGetProcAddress("glClearColor");
            glad_glClearDepth = (PFNGLCLEARDEPTHPROC)glfwGetProcAddress("glClearDepth");
            glad_glClearIndex = (PFNGLCLEARINDEXPROC)glfwGetProcAddress("glClearIndex");
            glad_glClearStencil = (PFNGLCLEARSTENCILPROC)glfwGetProcAddress("glClearStencil");
            glad_glClipPlane = (PFNGLCLIPPLANEPROC)glfwGetProcAddress("glClipPlane");
            glad_glColor3b = (PFNGLCOLOR3BPROC)glfwGetProcAddress("glColor3b");
            glad_glColor3bv = (PFNGLCOLOR3BVPROC)glfwGetProcAddress("glColor3bv");
            glad_glColor3d = (PFNGLCOLOR3DPROC)glfwGetProcAddress("glColor3d");
            glad_glColor3dv = (PFNGLCOLOR3DVPROC)glfwGetProcAddress("glColor3dv");
            glad_glColor3f = (PFNGLCOLOR3FPROC)glfwGetProcAddress("glColor3f");
            glad_glColor3fv = (PFNGLCOLOR3FVPROC)glfwGetProcAddress("glColor3fv");
            glad_glColor3i = (PFNGLCOLOR3IPROC)glfwGetProcAddress("glColor3i");
            glad_glColor3iv = (PFNGLCOLOR3IVPROC)glfwGetProcAddress("glColor3iv");
            glad_glColor3s = (PFNGLCOLOR3SPROC)glfwGetProcAddress("glColor3s");
            glad_glColor3sv = (PFNGLCOLOR3SVPROC)glfwGetProcAddress("glColor3sv");
            glad_glColor3ub = (PFNGLCOLOR3UBPROC)glfwGetProcAddress("glColor3ub");
            glad_glColor3ubv = (PFNGLCOLOR3UBVPROC)glfwGetProcAddress("glColor3ubv");
            glad_glColor3ui = (PFNGLCOLOR3UIPROC)glfwGetProcAddress("glColor3ui");
            glad_glColor3uiv = (PFNGLCOLOR3UIVPROC)glfwGetProcAddress("glColor3uiv");
            glad_glColor3us = (PFNGLCOLOR3USPROC)glfwGetProcAddress("glColor3us");
            glad_glColor3usv = (PFNGLCOLOR3USVPROC)glfwGetProcAddress("glColor3usv");
            glad_glColor4b = (PFNGLCOLOR4BPROC)glfwGetProcAddress("glColor4b");
            glad_glColor4bv = (PFNGLCOLOR4BVPROC)glfwGetProcAddress("glColor4bv");
            glad_glColor4d = (PFNGLCOLOR4DPROC)glfwGetProcAddress("glColor4d");
            glad_glColor4dv = (PFNGLCOLOR4DVPROC)glfwGetProcAddress("glColor4dv");
            glad_glColor4f = (PFNGLCOLOR4FPROC)glfwGetProcAddress("glColor4f");
            glad_glColor4fv = (PFNGLCOLOR4FVPROC)glfwGetProcAddress("glColor4fv");
            glad_glColor4i = (PFNGLCOLOR4IPROC)glfwGetProcAddress("glColor4i");
            glad_glColor4iv = (PFNGLCOLOR4IVPROC)glfwGetProcAddress("glColor4iv");
            glad_glColor4s = (PFNGLCOLOR4SPROC)glfwGetProcAddress("glColor4s");
            glad_glColor4sv = (PFNGLCOLOR4SVPROC)glfwGetProcAddress("glColor4sv");
            glad_glColor4ub = (PFNGLCOLOR4UBPROC)glfwGetProcAddress("glColor4ub");
            glad_glColor4ubv = (PFNGLCOLOR4UBVPROC)glfwGetProcAddress("glColor4ubv");
            glad_glColor4ui = (PFNGLCOLOR4UIPROC)glfwGetProcAddress("glColor4ui");
            glad_glColor4uiv = (PFNGLCOLOR4UIVPROC)glfwGetProcAddress("glColor4uiv");
            glad_glColor4us = (PFNGLCOLOR4USPROC)glfwGetProcAddress("glColor4us");
            glad_glColor4usv = (PFNGLCOLOR4USVPROC)glfwGetProcAddress("glColor4usv");
            glad_glColorMask = (PFNGLCOLORMASKPROC)glfwGetProcAddress("glColorMask");
            glad_glColorMaterial = (PFNGLCOLORMATERIALPROC)glfwGetProcAddress("glColorMaterial");
            glad_glCopyPixels = (PFNGLCOPYPIXELSPROC)glfwGetProcAddress("glCopyPixels");
            glad_glCullFace = (PFNGLCULLFACEPROC)glfwGetProcAddress("glCullFace");
            glad_glDeleteLists = (PFNGLDELETELISTSPROC)glfwGetProcAddress("glDeleteLists");
            glad_glDepthFunc = (PFNGLDEPTHFUNCPROC)glfwGetProcAddress("glDepthFunc");
            glad_glDepthMask = (PFNGLDEPTHMASKPROC)glfwGetProcAddress("glDepthMask");
            glad_glDepthRange = (PFNGLDEPTHRANGEPROC)glfwGetProcAddress("glDepthRange");
            glad_glDisable = (PFNGLDISABLEPROC)glfwGetProcAddress("glDisable");
            glad_glDrawBuffer = (PFNGLDRAWBUFFERPROC)glfwGetProcAddress("glDrawBuffer");
            glad_glDrawPixels = (PFNGLDRAWPIXELSPROC)glfwGetProcAddress("glDrawPixels");
            glad_glEdgeFlag = (PFNGLEDGEFLAGPROC)glfwGetProcAddress("glEdgeFlag");
            glad_glEdgeFlagv = (PFNGLEDGEFLAGVPROC)glfwGetProcAddress("glEdgeFlagv");
            glad_glEnable = (PFNGLENABLEPROC)glfwGetProcAddress("glEnable");
            glad_glEnd = glfwGetProcAddress("glEnd");
            glad_glEndList = glfwGetProcAddress("glEndList");
            glad_glEvalCoord1d = (PFNGLEVALCOORD1DPROC)glfwGetProcAddress("glEvalCoord1d");
            glad_glEvalCoord1dv = (PFNGLEVALCOORD1DVPROC)glfwGetProcAddress("glEvalCoord1dv");
            glad_glEvalCoord1f = (PFNGLEVALCOORD1FPROC)glfwGetProcAddress("glEvalCoord1f");
            glad_glEvalCoord1fv = (PFNGLEVALCOORD1FVPROC)glfwGetProcAddress("glEvalCoord1fv");
            glad_glEvalCoord2d = (PFNGLEVALCOORD2DPROC)glfwGetProcAddress("glEvalCoord2d");
            glad_glEvalCoord2dv = (PFNGLEVALCOORD2DVPROC)glfwGetProcAddress("glEvalCoord2dv");
            glad_glEvalCoord2f = (PFNGLEVALCOORD2FPROC)glfwGetProcAddress("glEvalCoord2f");
            glad_glEvalCoord2fv = (PFNGLEVALCOORD2FVPROC)glfwGetProcAddress("glEvalCoord2fv");
            glad_glEvalMesh1 = (PFNGLEVALMESH1PROC)glfwGetProcAddress("glEvalMesh1");
            glad_glEvalMesh2 = (PFNGLEVALMESH2PROC)glfwGetProcAddress("glEvalMesh2");
            glad_glEvalPoint1 = (PFNGLEVALPOINT1PROC)glfwGetProcAddress("glEvalPoint1");
            glad_glEvalPoint2 = (PFNGLEVALPOINT2PROC)glfwGetProcAddress("glEvalPoint2");
            glad_glFeedbackBuffer = (PFNGLFEEDBACKBUFFERPROC)glfwGetProcAddress("glFeedbackBuffer");
            glad_glFinish = glfwGetProcAddress("glFinish");
            glad_glFlush = glfwGetProcAddress("glFlush");
            glad_glFogf = (PFNGLFOGFPROC)glfwGetProcAddress("glFogf");
            glad_glFogfv = (PFNGLFOGFVPROC)glfwGetProcAddress("glFogfv");
            glad_glFogi = (PFNGLFOGIPROC)glfwGetProcAddress("glFogi");
            glad_glFogiv = (PFNGLFOGIVPROC)glfwGetProcAddress("glFogiv");
            glad_glFrontFace = (PFNGLFRONTFACEPROC)glfwGetProcAddress("glFrontFace");
            glad_glFrustum = (PFNGLFRUSTUMPROC)glfwGetProcAddress("glFrustum");
            glad_glGenLists = (PFNGLGENLISTSPROC)glfwGetProcAddress("glGenLists");
            glad_glGetBooleanv = (PFNGLGETBOOLEANVPROC)glfwGetProcAddress("glGetBooleanv");
            glad_glGetClipPlane = (PFNGLGETCLIPPLANEPROC)glfwGetProcAddress("glGetClipPlane");
            glad_glGetDoublev = (PFNGLGETDOUBLEVPROC)glfwGetProcAddress("glGetDoublev");
            glad_glGetError = (PFNGLGETERRORPROC)glfwGetProcAddress("glGetError");
            glad_glGetFloatv = (PFNGLGETFLOATVPROC)glfwGetProcAddress("glGetFloatv");
            glad_glGetIntegerv = (PFNGLGETINTEGERVPROC)glfwGetProcAddress("glGetIntegerv");
            glad_glGetLightfv = (PFNGLGETLIGHTFVPROC)glfwGetProcAddress("glGetLightfv");
            glad_glGetLightiv = (PFNGLGETLIGHTIVPROC)glfwGetProcAddress("glGetLightiv");
            glad_glGetMapdv = (PFNGLGETMAPDVPROC)glfwGetProcAddress("glGetMapdv");
            glad_glGetMapfv = (PFNGLGETMAPFVPROC)glfwGetProcAddress("glGetMapfv");
            glad_glGetMapiv = (PFNGLGETMAPIVPROC)glfwGetProcAddress("glGetMapiv");
            glad_glGetMaterialfv = (PFNGLGETMATERIALFVPROC)glfwGetProcAddress("glGetMaterialfv");
            glad_glGetMaterialiv = (PFNGLGETMATERIALIVPROC)glfwGetProcAddress("glGetMaterialiv");
            glad_glGetPixelMapfv = (PFNGLGETPIXELMAPFVPROC)glfwGetProcAddress("glGetPixelMapfv");
            glad_glGetPixelMapuiv = (PFNGLGETPIXELMAPUIVPROC)glfwGetProcAddress("glGetPixelMapuiv");
            glad_glGetPixelMapusv = (PFNGLGETPIXELMAPUSVPROC)glfwGetProcAddress("glGetPixelMapusv");
            glad_glGetPolygonStipple =
                 (PFNGLGETPOLYGONSTIPPLEPROC)glfwGetProcAddress("glGetPolygonStipple");
            glad_glGetString = (PFNGLGETSTRINGPROC)glfwGetProcAddress("glGetString");
            glad_glGetTexEnvfv = (PFNGLGETTEXENVFVPROC)glfwGetProcAddress("glGetTexEnvfv");
            glad_glGetTexEnviv = (PFNGLGETTEXENVIVPROC)glfwGetProcAddress("glGetTexEnviv");
            glad_glGetTexGendv = (PFNGLGETTEXGENDVPROC)glfwGetProcAddress("glGetTexGendv");
            glad_glGetTexGenfv = (PFNGLGETTEXGENFVPROC)glfwGetProcAddress("glGetTexGenfv");
            glad_glGetTexGeniv = (PFNGLGETTEXGENIVPROC)glfwGetProcAddress("glGetTexGeniv");
            glad_glGetTexImage = (PFNGLGETTEXIMAGEPROC)glfwGetProcAddress("glGetTexImage");
            glad_glGetTexLevelParameterfv =
                 (PFNGLGETTEXLEVELPARAMETERFVPROC)glfwGetProcAddress("glGetTexLevelParameterfv");
            glad_glGetTexLevelParameteriv =
                 (PFNGLGETTEXLEVELPARAMETERIVPROC)glfwGetProcAddress("glGetTexLevelParameteriv");
            glad_glGetTexParameterfv =
                 (PFNGLGETTEXPARAMETERFVPROC)glfwGetProcAddress("glGetTexParameterfv");
            glad_glGetTexParameteriv =
                 (PFNGLGETTEXPARAMETERIVPROC)glfwGetProcAddress("glGetTexParameteriv");
            glad_glHint = (PFNGLHINTPROC)glfwGetProcAddress("glHint");
            glad_glIndexMask = (PFNGLINDEXMASKPROC)glfwGetProcAddress("glIndexMask");
            glad_glIndexd = (PFNGLINDEXDPROC)glfwGetProcAddress("glIndexd");
            glad_glIndexdv = (PFNGLINDEXDVPROC)glfwGetProcAddress("glIndexdv");
            glad_glIndexf = (PFNGLINDEXFPROC)glfwGetProcAddress("glIndexf");
            glad_glIndexfv = (PFNGLINDEXFVPROC)glfwGetProcAddress("glIndexfv");
            glad_glIndexi = (PFNGLINDEXIPROC)glfwGetProcAddress("glIndexi");
            glad_glIndexiv = (PFNGLINDEXIVPROC)glfwGetProcAddress("glIndexiv");
            glad_glIndexs = (PFNGLINDEXSPROC)glfwGetProcAddress("glIndexs");
            glad_glIndexsv = (PFNGLINDEXSVPROC)glfwGetProcAddress("glIndexsv");
            glad_glInitNames = glfwGetProcAddress("glInitNames");
            glad_glIsEnabled = (PFNGLISENABLEDPROC)glfwGetProcAddress("glIsEnabled");
            glad_glIsList = (PFNGLISLISTPROC)glfwGetProcAddress("glIsList");
            glad_glLightModelf = (PFNGLLIGHTMODELFPROC)glfwGetProcAddress("glLightModelf");
            glad_glLightModelfv = (PFNGLLIGHTMODELFVPROC)glfwGetProcAddress("glLightModelfv");
            glad_glLightModeli = (PFNGLLIGHTMODELIPROC)glfwGetProcAddress("glLightModeli");
            glad_glLightModeliv = (PFNGLLIGHTMODELIVPROC)glfwGetProcAddress("glLightModeliv");
            glad_glLightf = (PFNGLLIGHTFPROC)glfwGetProcAddress("glLightf");
            glad_glLightfv = (PFNGLLIGHTFVPROC)glfwGetProcAddress("glLightfv");
            glad_glLighti = (PFNGLLIGHTIPROC)glfwGetProcAddress("glLighti");
            glad_glLightiv = (PFNGLLIGHTIVPROC)glfwGetProcAddress("glLightiv");
            glad_glLineStipple = (PFNGLLINESTIPPLEPROC)glfwGetProcAddress("glLineStipple");
            glad_glLineWidth = (PFNGLLINEWIDTHPROC)glfwGetProcAddress("glLineWidth");
            glad_glListBase = (PFNGLLISTBASEPROC)glfwGetProcAddress("glListBase");
            glad_glLoadIdentity = glfwGetProcAddress("glLoadIdentity");
            glad_glLoadMatrixd = (PFNGLLOADMATRIXDPROC)glfwGetProcAddress("glLoadMatrixd");
            glad_glLoadMatrixf = (PFNGLLOADMATRIXFPROC)glfwGetProcAddress("glLoadMatrixf");
            glad_glLoadName = (PFNGLLOADNAMEPROC)glfwGetProcAddress("glLoadName");
            glad_glLogicOp = (PFNGLLOGICOPPROC)glfwGetProcAddress("glLogicOp");
            glad_glMap1d = (PFNGLMAP1DPROC)glfwGetProcAddress("glMap1d");
            glad_glMap1f = (PFNGLMAP1FPROC)glfwGetProcAddress("glMap1f");
            glad_glMap2d = (PFNGLMAP2DPROC)glfwGetProcAddress("glMap2d");
            glad_glMap2f = (PFNGLMAP2FPROC)glfwGetProcAddress("glMap2f");
            glad_glMapGrid1d = (PFNGLMAPGRID1DPROC)glfwGetProcAddress("glMapGrid1d");
            glad_glMapGrid1f = (PFNGLMAPGRID1FPROC)glfwGetProcAddress("glMapGrid1f");
            glad_glMapGrid2d = (PFNGLMAPGRID2DPROC)glfwGetProcAddress("glMapGrid2d");
            glad_glMapGrid2f = (PFNGLMAPGRID2FPROC)glfwGetProcAddress("glMapGrid2f");
            glad_glMaterialf = (PFNGLMATERIALFPROC)glfwGetProcAddress("glMaterialf");
            glad_glMaterialfv = (PFNGLMATERIALFVPROC)glfwGetProcAddress("glMaterialfv");
            glad_glMateriali = (PFNGLMATERIALIPROC)glfwGetProcAddress("glMateriali");
            glad_glMaterialiv = (PFNGLMATERIALIVPROC)glfwGetProcAddress("glMaterialiv");
            glad_glMatrixMode = (PFNGLMATRIXMODEPROC)glfwGetProcAddress("glMatrixMode");
            glad_glMultMatrixd = (PFNGLMULTMATRIXDPROC)glfwGetProcAddress("glMultMatrixd");
            glad_glMultMatrixf = (PFNGLMULTMATRIXFPROC)glfwGetProcAddress("glMultMatrixf");
            glad_glNewList = (PFNGLNEWLISTPROC)glfwGetProcAddress("glNewList");
            glad_glNormal3b = (PFNGLNORMAL3BPROC)glfwGetProcAddress("glNormal3b");
            glad_glNormal3bv = (PFNGLNORMAL3BVPROC)glfwGetProcAddress("glNormal3bv");
            glad_glNormal3d = (PFNGLNORMAL3DPROC)glfwGetProcAddress("glNormal3d");
            glad_glNormal3dv = (PFNGLNORMAL3DVPROC)glfwGetProcAddress("glNormal3dv");
            glad_glNormal3f = (PFNGLNORMAL3FPROC)glfwGetProcAddress("glNormal3f");
            glad_glNormal3fv = (PFNGLNORMAL3FVPROC)glfwGetProcAddress("glNormal3fv");
            glad_glNormal3i = (PFNGLNORMAL3IPROC)glfwGetProcAddress("glNormal3i");
            glad_glNormal3iv = (PFNGLNORMAL3IVPROC)glfwGetProcAddress("glNormal3iv");
            glad_glNormal3s = (PFNGLNORMAL3SPROC)glfwGetProcAddress("glNormal3s");
            glad_glNormal3sv = (PFNGLNORMAL3SVPROC)glfwGetProcAddress("glNormal3sv");
            glad_glOrtho = (PFNGLORTHOPROC)glfwGetProcAddress("glOrtho");
            glad_glPassThrough = (PFNGLPASSTHROUGHPROC)glfwGetProcAddress("glPassThrough");
            glad_glPixelMapfv = (PFNGLPIXELMAPFVPROC)glfwGetProcAddress("glPixelMapfv");
            glad_glPixelMapuiv = (PFNGLPIXELMAPUIVPROC)glfwGetProcAddress("glPixelMapuiv");
            glad_glPixelMapusv = (PFNGLPIXELMAPUSVPROC)glfwGetProcAddress("glPixelMapusv");
            glad_glPixelStoref = (PFNGLPIXELSTOREFPROC)glfwGetProcAddress("glPixelStoref");
            glad_glPixelStorei = (PFNGLPIXELSTOREIPROC)glfwGetProcAddress("glPixelStorei");
            glad_glPixelTransferf = (PFNGLPIXELTRANSFERFPROC)glfwGetProcAddress("glPixelTransferf");
            glad_glPixelTransferi = (PFNGLPIXELTRANSFERIPROC)glfwGetProcAddress("glPixelTransferi");
            glad_glPixelZoom = (PFNGLPIXELZOOMPROC)glfwGetProcAddress("glPixelZoom");
            glad_glPointSize = (PFNGLPOINTSIZEPROC)glfwGetProcAddress("glPointSize");
            glad_glPolygonMode = (PFNGLPOLYGONMODEPROC)glfwGetProcAddress("glPolygonMode");
            glad_glPolygonStipple = (PFNGLPOLYGONSTIPPLEPROC)glfwGetProcAddress("glPolygonStipple");
            glad_glPopAttrib = glfwGetProcAddress("glPopAttrib");
            glad_glPopMatrix = glfwGetProcAddress("glPopMatrix");
            glad_glPopName = glfwGetProcAddress("glPopName");
            glad_glPushAttrib = (PFNGLPUSHATTRIBPROC)glfwGetProcAddress("glPushAttrib");
            glad_glPushMatrix = glfwGetProcAddress("glPushMatrix");
            glad_glPushName = (PFNGLPUSHNAMEPROC)glfwGetProcAddress("glPushName");
            glad_glRasterPos2d = (PFNGLRASTERPOS2DPROC)glfwGetProcAddress("glRasterPos2d");
            glad_glRasterPos2dv = (PFNGLRASTERPOS2DVPROC)glfwGetProcAddress("glRasterPos2dv");
            glad_glRasterPos2f = (PFNGLRASTERPOS2FPROC)glfwGetProcAddress("glRasterPos2f");
            glad_glRasterPos2fv = (PFNGLRASTERPOS2FVPROC)glfwGetProcAddress("glRasterPos2fv");
            glad_glRasterPos2i = (PFNGLRASTERPOS2IPROC)glfwGetProcAddress("glRasterPos2i");
            glad_glRasterPos2iv = (PFNGLRASTERPOS2IVPROC)glfwGetProcAddress("glRasterPos2iv");
            glad_glRasterPos2s = (PFNGLRASTERPOS2SPROC)glfwGetProcAddress("glRasterPos2s");
            glad_glRasterPos2sv = (PFNGLRASTERPOS2SVPROC)glfwGetProcAddress("glRasterPos2sv");
            glad_glRasterPos3d = (PFNGLRASTERPOS3DPROC)glfwGetProcAddress("glRasterPos3d");
            glad_glRasterPos3dv = (PFNGLRASTERPOS3DVPROC)glfwGetProcAddress("glRasterPos3dv");
            glad_glRasterPos3f = (PFNGLRASTERPOS3FPROC)glfwGetProcAddress("glRasterPos3f");
            glad_glRasterPos3fv = (PFNGLRASTERPOS3FVPROC)glfwGetProcAddress("glRasterPos3fv");
            glad_glRasterPos3i = (PFNGLRASTERPOS3IPROC)glfwGetProcAddress("glRasterPos3i");
            glad_glRasterPos3iv = (PFNGLRASTERPOS3IVPROC)glfwGetProcAddress("glRasterPos3iv");
            glad_glRasterPos3s = (PFNGLRASTERPOS3SPROC)glfwGetProcAddress("glRasterPos3s");
            glad_glRasterPos3sv = (PFNGLRASTERPOS3SVPROC)glfwGetProcAddress("glRasterPos3sv");
            glad_glRasterPos4d = (PFNGLRASTERPOS4DPROC)glfwGetProcAddress("glRasterPos4d");
            glad_glRasterPos4dv = (PFNGLRASTERPOS4DVPROC)glfwGetProcAddress("glRasterPos4dv");
            glad_glRasterPos4f = (PFNGLRASTERPOS4FPROC)glfwGetProcAddress("glRasterPos4f");
            glad_glRasterPos4fv = (PFNGLRASTERPOS4FVPROC)glfwGetProcAddress("glRasterPos4fv");
            glad_glRasterPos4i = (PFNGLRASTERPOS4IPROC)glfwGetProcAddress("glRasterPos4i");
            glad_glRasterPos4iv = (PFNGLRASTERPOS4IVPROC)glfwGetProcAddress("glRasterPos4iv");
            glad_glRasterPos4s = (PFNGLRASTERPOS4SPROC)glfwGetProcAddress("glRasterPos4s");
            glad_glRasterPos4sv = (PFNGLRASTERPOS4SVPROC)glfwGetProcAddress("glRasterPos4sv");
            glad_glReadBuffer = (PFNGLREADBUFFERPROC)glfwGetProcAddress("glReadBuffer");
            glad_glReadPixels = (PFNGLREADPIXELSPROC)glfwGetProcAddress("glReadPixels");
            glad_glRectd = (PFNGLRECTDPROC)glfwGetProcAddress("glRectd");
            glad_glRectdv = (PFNGLRECTDVPROC)glfwGetProcAddress("glRectdv");
            glad_glRectf = (PFNGLRECTFPROC)glfwGetProcAddress("glRectf");
            glad_glRectfv = (PFNGLRECTFVPROC)glfwGetProcAddress("glRectfv");
            glad_glRecti = (PFNGLRECTIPROC)glfwGetProcAddress("glRecti");
            glad_glRectiv = (PFNGLRECTIVPROC)glfwGetProcAddress("glRectiv");
            glad_glRects = (PFNGLRECTSPROC)glfwGetProcAddress("glRects");
            glad_glRectsv = (PFNGLRECTSVPROC)glfwGetProcAddress("glRectsv");
            glad_glRenderMode = (PFNGLRENDERMODEPROC)glfwGetProcAddress("glRenderMode");
            glad_glRotated = (PFNGLROTATEDPROC)glfwGetProcAddress("glRotated");
            glad_glRotatef = (PFNGLROTATEFPROC)glfwGetProcAddress("glRotatef");
            glad_glScaled = (PFNGLSCALEDPROC)glfwGetProcAddress("glScaled");
            glad_glScalef = (PFNGLSCALEFPROC)glfwGetProcAddress("glScalef");
            glad_glScissor = (PFNGLSCISSORPROC)glfwGetProcAddress("glScissor");
            glad_glSelectBuffer = (PFNGLSELECTBUFFERPROC)glfwGetProcAddress("glSelectBuffer");
            glad_glShadeModel = (PFNGLSHADEMODELPROC)glfwGetProcAddress("glShadeModel");
            glad_glStencilFunc = (PFNGLSTENCILFUNCPROC)glfwGetProcAddress("glStencilFunc");
            glad_glStencilMask = (PFNGLSTENCILMASKPROC)glfwGetProcAddress("glStencilMask");
            glad_glStencilOp = (PFNGLSTENCILOPPROC)glfwGetProcAddress("glStencilOp");
            glad_glTexCoord1d = (PFNGLTEXCOORD1DPROC)glfwGetProcAddress("glTexCoord1d");
            glad_glTexCoord1dv = (PFNGLTEXCOORD1DVPROC)glfwGetProcAddress("glTexCoord1dv");
            glad_glTexCoord1f = (PFNGLTEXCOORD1FPROC)glfwGetProcAddress("glTexCoord1f");
            glad_glTexCoord1fv = (PFNGLTEXCOORD1FVPROC)glfwGetProcAddress("glTexCoord1fv");
            glad_glTexCoord1i = (PFNGLTEXCOORD1IPROC)glfwGetProcAddress("glTexCoord1i");
            glad_glTexCoord1iv = (PFNGLTEXCOORD1IVPROC)glfwGetProcAddress("glTexCoord1iv");
            glad_glTexCoord1s = (PFNGLTEXCOORD1SPROC)glfwGetProcAddress("glTexCoord1s");
            glad_glTexCoord1sv = (PFNGLTEXCOORD1SVPROC)glfwGetProcAddress("glTexCoord1sv");
            glad_glTexCoord2d = (PFNGLTEXCOORD2DPROC)glfwGetProcAddress("glTexCoord2d");
            glad_glTexCoord2dv = (PFNGLTEXCOORD2DVPROC)glfwGetProcAddress("glTexCoord2dv");
            glad_glTexCoord2f = (PFNGLTEXCOORD2FPROC)glfwGetProcAddress("glTexCoord2f");
            glad_glTexCoord2fv = (PFNGLTEXCOORD2FVPROC)glfwGetProcAddress("glTexCoord2fv");
            glad_glTexCoord2i = (PFNGLTEXCOORD2IPROC)glfwGetProcAddress("glTexCoord2i");
            glad_glTexCoord2iv = (PFNGLTEXCOORD2IVPROC)glfwGetProcAddress("glTexCoord2iv");
            glad_glTexCoord2s = (PFNGLTEXCOORD2SPROC)glfwGetProcAddress("glTexCoord2s");
            glad_glTexCoord2sv = (PFNGLTEXCOORD2SVPROC)glfwGetProcAddress("glTexCoord2sv");
            glad_glTexCoord3d = (PFNGLTEXCOORD3DPROC)glfwGetProcAddress("glTexCoord3d");
            glad_glTexCoord3dv = (PFNGLTEXCOORD3DVPROC)glfwGetProcAddress("glTexCoord3dv");
            glad_glTexCoord3f = (PFNGLTEXCOORD3FPROC)glfwGetProcAddress("glTexCoord3f");
            glad_glTexCoord3fv = (PFNGLTEXCOORD3FVPROC)glfwGetProcAddress("glTexCoord3fv");
            glad_glTexCoord3i = (PFNGLTEXCOORD3IPROC)glfwGetProcAddress("glTexCoord3i");
            glad_glTexCoord3iv = (PFNGLTEXCOORD3IVPROC)glfwGetProcAddress("glTexCoord3iv");
            glad_glTexCoord3s = (PFNGLTEXCOORD3SPROC)glfwGetProcAddress("glTexCoord3s");
            glad_glTexCoord3sv = (PFNGLTEXCOORD3SVPROC)glfwGetProcAddress("glTexCoord3sv");
            glad_glTexCoord4d = (PFNGLTEXCOORD4DPROC)glfwGetProcAddress("glTexCoord4d");
            glad_glTexCoord4dv = (PFNGLTEXCOORD4DVPROC)glfwGetProcAddress("glTexCoord4dv");
            glad_glTexCoord4f = (PFNGLTEXCOORD4FPROC)glfwGetProcAddress("glTexCoord4f");
            glad_glTexCoord4fv = (PFNGLTEXCOORD4FVPROC)glfwGetProcAddress("glTexCoord4fv");
            glad_glTexCoord4i = (PFNGLTEXCOORD4IPROC)glfwGetProcAddress("glTexCoord4i");
            glad_glTexCoord4iv = (PFNGLTEXCOORD4IVPROC)glfwGetProcAddress("glTexCoord4iv");
            glad_glTexCoord4s = (PFNGLTEXCOORD4SPROC)glfwGetProcAddress("glTexCoord4s");
            glad_glTexCoord4sv = (PFNGLTEXCOORD4SVPROC)glfwGetProcAddress("glTexCoord4sv");
            glad_glTexEnvf = (PFNGLTEXENVFPROC)glfwGetProcAddress("glTexEnvf");
            glad_glTexEnvfv = (PFNGLTEXENVFVPROC)glfwGetProcAddress("glTexEnvfv");
            glad_glTexEnvi = (PFNGLTEXENVIPROC)glfwGetProcAddress("glTexEnvi");
            glad_glTexEnviv = (PFNGLTEXENVIVPROC)glfwGetProcAddress("glTexEnviv");
            glad_glTexGend = (PFNGLTEXGENDPROC)glfwGetProcAddress("glTexGend");
            glad_glTexGendv = (PFNGLTEXGENDVPROC)glfwGetProcAddress("glTexGendv");
            glad_glTexGenf = (PFNGLTEXGENFPROC)glfwGetProcAddress("glTexGenf");
            glad_glTexGenfv = (PFNGLTEXGENFVPROC)glfwGetProcAddress("glTexGenfv");
            glad_glTexGeni = (PFNGLTEXGENIPROC)glfwGetProcAddress("glTexGeni");
            glad_glTexGeniv = (PFNGLTEXGENIVPROC)glfwGetProcAddress("glTexGeniv");
            glad_glTexImage1D = (PFNGLTEXIMAGE1DPROC)glfwGetProcAddress("glTexImage1D");
            glad_glTexImage2D = (PFNGLTEXIMAGE2DPROC)glfwGetProcAddress("glTexImage2D");
            glad_glTexParameterf = (PFNGLTEXPARAMETERFPROC)glfwGetProcAddress("glTexParameterf");
            glad_glTexParameterfv = (PFNGLTEXPARAMETERFVPROC)glfwGetProcAddress("glTexParameterfv");
            glad_glTexParameteri = (PFNGLTEXPARAMETERIPROC)glfwGetProcAddress("glTexParameteri");
            glad_glTexParameteriv = (PFNGLTEXPARAMETERIVPROC)glfwGetProcAddress("glTexParameteriv");
            glad_glTranslated = (PFNGLTRANSLATEDPROC)glfwGetProcAddress("glTranslated");
            glad_glTranslatef = (PFNGLTRANSLATEFPROC)glfwGetProcAddress("glTranslatef");
            glad_glVertex2d = (PFNGLVERTEX2DPROC)glfwGetProcAddress("glVertex2d");
            glad_glVertex2dv = (PFNGLVERTEX2DVPROC)glfwGetProcAddress("glVertex2dv");
            glad_glVertex2f = (PFNGLVERTEX2FPROC)glfwGetProcAddress("glVertex2f");
            glad_glVertex2fv = (PFNGLVERTEX2FVPROC)glfwGetProcAddress("glVertex2fv");
            glad_glVertex2i = (PFNGLVERTEX2IPROC)glfwGetProcAddress("glVertex2i");
            glad_glVertex2iv = (PFNGLVERTEX2IVPROC)glfwGetProcAddress("glVertex2iv");
            glad_glVertex2s = (PFNGLVERTEX2SPROC)glfwGetProcAddress("glVertex2s");
            glad_glVertex2sv = (PFNGLVERTEX2SVPROC)glfwGetProcAddress("glVertex2sv");
            glad_glVertex3d = (PFNGLVERTEX3DPROC)glfwGetProcAddress("glVertex3d");
            glad_glVertex3dv = (PFNGLVERTEX3DVPROC)glfwGetProcAddress("glVertex3dv");
            glad_glVertex3f = (PFNGLVERTEX3FPROC)glfwGetProcAddress("glVertex3f");
            glad_glVertex3fv = (PFNGLVERTEX3FVPROC)glfwGetProcAddress("glVertex3fv");
            glad_glVertex3i = (PFNGLVERTEX3IPROC)glfwGetProcAddress("glVertex3i");
            glad_glVertex3iv = (PFNGLVERTEX3IVPROC)glfwGetProcAddress("glVertex3iv");
            glad_glVertex3s = (PFNGLVERTEX3SPROC)glfwGetProcAddress("glVertex3s");
            glad_glVertex3sv = (PFNGLVERTEX3SVPROC)glfwGetProcAddress("glVertex3sv");
            glad_glVertex4d = (PFNGLVERTEX4DPROC)glfwGetProcAddress("glVertex4d");
            glad_glVertex4dv = (PFNGLVERTEX4DVPROC)glfwGetProcAddress("glVertex4dv");
            glad_glVertex4f = (PFNGLVERTEX4FPROC)glfwGetProcAddress("glVertex4f");
            glad_glVertex4fv = (PFNGLVERTEX4FVPROC)glfwGetProcAddress("glVertex4fv");
            glad_glVertex4i = (PFNGLVERTEX4IPROC)glfwGetProcAddress("glVertex4i");
            glad_glVertex4iv = (PFNGLVERTEX4IVPROC)glfwGetProcAddress("glVertex4iv");
            glad_glVertex4s = (PFNGLVERTEX4SPROC)glfwGetProcAddress("glVertex4s");
            glad_glVertex4sv = (PFNGLVERTEX4SVPROC)glfwGetProcAddress("glVertex4sv");
            glad_glViewport = (PFNGLVIEWPORTPROC)glfwGetProcAddress("glViewport");
          }
          if (GLAD_GL_VERSION_1_1 != 0) {
            glad_glAreTexturesResident =
                 (PFNGLARETEXTURESRESIDENTPROC)glfwGetProcAddress("glAreTexturesResident");
            glad_glArrayElement = (PFNGLARRAYELEMENTPROC)glfwGetProcAddress("glArrayElement");
            glad_glBindTexture = (PFNGLBINDTEXTUREPROC)glfwGetProcAddress("glBindTexture");
            glad_glColorPointer = (PFNGLCOLORPOINTERPROC)glfwGetProcAddress("glColorPointer");
            glad_glCopyTexImage1D = (PFNGLCOPYTEXIMAGE1DPROC)glfwGetProcAddress("glCopyTexImage1D");
            glad_glCopyTexImage2D = (PFNGLCOPYTEXIMAGE2DPROC)glfwGetProcAddress("glCopyTexImage2D");
            glad_glCopyTexSubImage1D =
                 (PFNGLCOPYTEXSUBIMAGE1DPROC)glfwGetProcAddress("glCopyTexSubImage1D");
            glad_glCopyTexSubImage2D =
                 (PFNGLCOPYTEXSUBIMAGE2DPROC)glfwGetProcAddress("glCopyTexSubImage2D");
            glad_glDeleteTextures = (PFNGLDELETETEXTURESPROC)glfwGetProcAddress("glDeleteTextures");
            glad_glDisableClientState =
                 (PFNGLDISABLECLIENTSTATEPROC)glfwGetProcAddress("glDisableClientState");
            glad_glDrawArrays = (PFNGLDRAWARRAYSPROC)glfwGetProcAddress("glDrawArrays");
            glad_glDrawElements = (PFNGLDRAWELEMENTSPROC)glfwGetProcAddress("glDrawElements");
            glad_glEdgeFlagPointer =
                 (PFNGLEDGEFLAGPOINTERPROC)glfwGetProcAddress("glEdgeFlagPointer");
            glad_glEnableClientState =
                 (PFNGLENABLECLIENTSTATEPROC)glfwGetProcAddress("glEnableClientState");
            glad_glGenTextures = (PFNGLGENTEXTURESPROC)glfwGetProcAddress("glGenTextures");
            glad_glGetPointerv = (PFNGLGETPOINTERVPROC)glfwGetProcAddress("glGetPointerv");
            glad_glIndexPointer = (PFNGLINDEXPOINTERPROC)glfwGetProcAddress("glIndexPointer");
            glad_glIndexub = (PFNGLINDEXUBPROC)glfwGetProcAddress("glIndexub");
            glad_glIndexubv = (PFNGLINDEXUBVPROC)glfwGetProcAddress("glIndexubv");
            glad_glInterleavedArrays =
                 (PFNGLINTERLEAVEDARRAYSPROC)glfwGetProcAddress("glInterleavedArrays");
            glad_glIsTexture = (PFNGLISTEXTUREPROC)glfwGetProcAddress("glIsTexture");
            glad_glNormalPointer = (PFNGLNORMALPOINTERPROC)glfwGetProcAddress("glNormalPointer");
            glad_glPolygonOffset = (PFNGLPOLYGONOFFSETPROC)glfwGetProcAddress("glPolygonOffset");
            glad_glPopClientAttrib = glfwGetProcAddress("glPopClientAttrib");
            glad_glPrioritizeTextures =
                 (PFNGLPRIORITIZETEXTURESPROC)glfwGetProcAddress("glPrioritizeTextures");
            glad_glPushClientAttrib =
                 (PFNGLPUSHCLIENTATTRIBPROC)glfwGetProcAddress("glPushClientAttrib");
            glad_glTexCoordPointer =
                 (PFNGLTEXCOORDPOINTERPROC)glfwGetProcAddress("glTexCoordPointer");
            glad_glTexSubImage1D = (PFNGLTEXSUBIMAGE1DPROC)glfwGetProcAddress("glTexSubImage1D");
            glad_glTexSubImage2D = (PFNGLTEXSUBIMAGE2DPROC)glfwGetProcAddress("glTexSubImage2D");
            glad_glVertexPointer = (PFNGLVERTEXPOINTERPROC)glfwGetProcAddress("glVertexPointer");
          }
          if (GLAD_GL_VERSION_1_2 != 0) {
            glad_glCopyTexSubImage3D =
                 (PFNGLCOPYTEXSUBIMAGE3DPROC)glfwGetProcAddress("glCopyTexSubImage3D");
            glad_glDrawRangeElements =
                 (PFNGLDRAWRANGEELEMENTSPROC)glfwGetProcAddress("glDrawRangeElements");
            glad_glTexImage3D = (PFNGLTEXIMAGE3DPROC)glfwGetProcAddress("glTexImage3D");
            glad_glTexSubImage3D = (PFNGLTEXSUBIMAGE3DPROC)glfwGetProcAddress("glTexSubImage3D");
          }
          if (GLAD_GL_VERSION_1_3 != 0) {
            glad_glActiveTexture = (PFNGLACTIVETEXTUREPROC)glfwGetProcAddress("glActiveTexture");
            glad_glClientActiveTexture =
                 (PFNGLCLIENTACTIVETEXTUREPROC)glfwGetProcAddress("glClientActiveTexture");
            glad_glCompressedTexImage1D =
                 (PFNGLCOMPRESSEDTEXIMAGE1DPROC)glfwGetProcAddress("glCompressedTexImage1D");
            glad_glCompressedTexImage2D =
                 (PFNGLCOMPRESSEDTEXIMAGE2DPROC)glfwGetProcAddress("glCompressedTexImage2D");
            glad_glCompressedTexImage3D =
                 (PFNGLCOMPRESSEDTEXIMAGE3DPROC)glfwGetProcAddress("glCompressedTexImage3D");
            glad_glCompressedTexSubImage1D =
                 (PFNGLCOMPRESSEDTEXSUBIMAGE1DPROC)glfwGetProcAddress("glCompressedTexSubImage1D");
            glad_glCompressedTexSubImage2D =
                 (PFNGLCOMPRESSEDTEXSUBIMAGE2DPROC)glfwGetProcAddress("glCompressedTexSubImage2D");
            glad_glCompressedTexSubImage3D =
                 (PFNGLCOMPRESSEDTEXSUBIMAGE3DPROC)glfwGetProcAddress("glCompressedTexSubImage3D");
            glad_glGetCompressedTexImage =
                 (PFNGLGETCOMPRESSEDTEXIMAGEPROC)glfwGetProcAddress("glGetCompressedTexImage");
            glad_glLoadTransposeMatrixd =
                 (PFNGLLOADTRANSPOSEMATRIXDPROC)glfwGetProcAddress("glLoadTransposeMatrixd");
            glad_glLoadTransposeMatrixf =
                 (PFNGLLOADTRANSPOSEMATRIXFPROC)glfwGetProcAddress("glLoadTransposeMatrixf");
            glad_glMultTransposeMatrixd =
                 (PFNGLMULTTRANSPOSEMATRIXDPROC)glfwGetProcAddress("glMultTransposeMatrixd");
            glad_glMultTransposeMatrixf =
                 (PFNGLMULTTRANSPOSEMATRIXFPROC)glfwGetProcAddress("glMultTransposeMatrixf");
            glad_glMultiTexCoord1d =
                 (PFNGLMULTITEXCOORD1DPROC)glfwGetProcAddress("glMultiTexCoord1d");
            glad_glMultiTexCoord1dv =
                 (PFNGLMULTITEXCOORD1DVPROC)glfwGetProcAddress("glMultiTexCoord1dv");
            glad_glMultiTexCoord1f =
                 (PFNGLMULTITEXCOORD1FPROC)glfwGetProcAddress("glMultiTexCoord1f");
            glad_glMultiTexCoord1fv =
                 (PFNGLMULTITEXCOORD1FVPROC)glfwGetProcAddress("glMultiTexCoord1fv");
            glad_glMultiTexCoord1i =
                 (PFNGLMULTITEXCOORD1IPROC)glfwGetProcAddress("glMultiTexCoord1i");
            glad_glMultiTexCoord1iv =
                 (PFNGLMULTITEXCOORD1IVPROC)glfwGetProcAddress("glMultiTexCoord1iv");
            glad_glMultiTexCoord1s =
                 (PFNGLMULTITEXCOORD1SPROC)glfwGetProcAddress("glMultiTexCoord1s");
            glad_glMultiTexCoord1sv =
                 (PFNGLMULTITEXCOORD1SVPROC)glfwGetProcAddress("glMultiTexCoord1sv");
            glad_glMultiTexCoord2d =
                 (PFNGLMULTITEXCOORD2DPROC)glfwGetProcAddress("glMultiTexCoord2d");
            glad_glMultiTexCoord2dv =
                 (PFNGLMULTITEXCOORD2DVPROC)glfwGetProcAddress("glMultiTexCoord2dv");
            glad_glMultiTexCoord2f =
                 (PFNGLMULTITEXCOORD2FPROC)glfwGetProcAddress("glMultiTexCoord2f");
            glad_glMultiTexCoord2fv =
                 (PFNGLMULTITEXCOORD2FVPROC)glfwGetProcAddress("glMultiTexCoord2fv");
            glad_glMultiTexCoord2i =
                 (PFNGLMULTITEXCOORD2IPROC)glfwGetProcAddress("glMultiTexCoord2i");
            glad_glMultiTexCoord2iv =
                 (PFNGLMULTITEXCOORD2IVPROC)glfwGetProcAddress("glMultiTexCoord2iv");
            glad_glMultiTexCoord2s =
                 (PFNGLMULTITEXCOORD2SPROC)glfwGetProcAddress("glMultiTexCoord2s");
            glad_glMultiTexCoord2sv =
                 (PFNGLMULTITEXCOORD2SVPROC)glfwGetProcAddress("glMultiTexCoord2sv");
            glad_glMultiTexCoord3d =
                 (PFNGLMULTITEXCOORD3DPROC)glfwGetProcAddress("glMultiTexCoord3d");
            glad_glMultiTexCoord3dv =
                 (PFNGLMULTITEXCOORD3DVPROC)glfwGetProcAddress("glMultiTexCoord3dv");
            glad_glMultiTexCoord3f =
                 (PFNGLMULTITEXCOORD3FPROC)glfwGetProcAddress("glMultiTexCoord3f");
            glad_glMultiTexCoord3fv =
                 (PFNGLMULTITEXCOORD3FVPROC)glfwGetProcAddress("glMultiTexCoord3fv");
            glad_glMultiTexCoord3i =
                 (PFNGLMULTITEXCOORD3IPROC)glfwGetProcAddress("glMultiTexCoord3i");
            glad_glMultiTexCoord3iv =
                 (PFNGLMULTITEXCOORD3IVPROC)glfwGetProcAddress("glMultiTexCoord3iv");
            glad_glMultiTexCoord3s =
                 (PFNGLMULTITEXCOORD3SPROC)glfwGetProcAddress("glMultiTexCoord3s");
            glad_glMultiTexCoord3sv =
                 (PFNGLMULTITEXCOORD3SVPROC)glfwGetProcAddress("glMultiTexCoord3sv");
            glad_glMultiTexCoord4d =
                 (PFNGLMULTITEXCOORD4DPROC)glfwGetProcAddress("glMultiTexCoord4d");
            glad_glMultiTexCoord4dv =
                 (PFNGLMULTITEXCOORD4DVPROC)glfwGetProcAddress("glMultiTexCoord4dv");
            glad_glMultiTexCoord4f =
                 (PFNGLMULTITEXCOORD4FPROC)glfwGetProcAddress("glMultiTexCoord4f");
            glad_glMultiTexCoord4fv =
                 (PFNGLMULTITEXCOORD4FVPROC)glfwGetProcAddress("glMultiTexCoord4fv");
            glad_glMultiTexCoord4i =
                 (PFNGLMULTITEXCOORD4IPROC)glfwGetProcAddress("glMultiTexCoord4i");
            glad_glMultiTexCoord4iv =
                 (PFNGLMULTITEXCOORD4IVPROC)glfwGetProcAddress("glMultiTexCoord4iv");
            glad_glMultiTexCoord4s =
                 (PFNGLMULTITEXCOORD4SPROC)glfwGetProcAddress("glMultiTexCoord4s");
            glad_glMultiTexCoord4sv =
                 (PFNGLMULTITEXCOORD4SVPROC)glfwGetProcAddress("glMultiTexCoord4sv");
            glad_glSampleCoverage = (PFNGLSAMPLECOVERAGEPROC)glfwGetProcAddress("glSampleCoverage");
          }
          if (GLAD_GL_VERSION_1_4 != 0) {
            glad_glBlendColor = (PFNGLBLENDCOLORPROC)glfwGetProcAddress("glBlendColor");
            glad_glBlendEquation = (PFNGLBLENDEQUATIONPROC)glfwGetProcAddress("glBlendEquation");
            glad_glBlendFuncSeparate =
                 (PFNGLBLENDFUNCSEPARATEPROC)glfwGetProcAddress("glBlendFuncSeparate");
            glad_glFogCoordPointer =
                 (PFNGLFOGCOORDPOINTERPROC)glfwGetProcAddress("glFogCoordPointer");
            glad_glFogCoordd = (PFNGLFOGCOORDDPROC)glfwGetProcAddress("glFogCoordd");
            glad_glFogCoorddv = (PFNGLFOGCOORDDVPROC)glfwGetProcAddress("glFogCoorddv");
            glad_glFogCoordf = (PFNGLFOGCOORDFPROC)glfwGetProcAddress("glFogCoordf");
            glad_glFogCoordfv = (PFNGLFOGCOORDFVPROC)glfwGetProcAddress("glFogCoordfv");
            glad_glMultiDrawArrays =
                 (PFNGLMULTIDRAWARRAYSPROC)glfwGetProcAddress("glMultiDrawArrays");
            glad_glMultiDrawElements =
                 (PFNGLMULTIDRAWELEMENTSPROC)glfwGetProcAddress("glMultiDrawElements");
            glad_glPointParameterf =
                 (PFNGLPOINTPARAMETERFPROC)glfwGetProcAddress("glPointParameterf");
            glad_glPointParameterfv =
                 (PFNGLPOINTPARAMETERFVPROC)glfwGetProcAddress("glPointParameterfv");
            glad_glPointParameteri =
                 (PFNGLPOINTPARAMETERIPROC)glfwGetProcAddress("glPointParameteri");
            glad_glPointParameteriv =
                 (PFNGLPOINTPARAMETERIVPROC)glfwGetProcAddress("glPointParameteriv");
            glad_glSecondaryColor3b =
                 (PFNGLSECONDARYCOLOR3BPROC)glfwGetProcAddress("glSecondaryColor3b");
            glad_glSecondaryColor3bv =
                 (PFNGLSECONDARYCOLOR3BVPROC)glfwGetProcAddress("glSecondaryColor3bv");
            glad_glSecondaryColor3d =
                 (PFNGLSECONDARYCOLOR3DPROC)glfwGetProcAddress("glSecondaryColor3d");
            glad_glSecondaryColor3dv =
                 (PFNGLSECONDARYCOLOR3DVPROC)glfwGetProcAddress("glSecondaryColor3dv");
            glad_glSecondaryColor3f =
                 (PFNGLSECONDARYCOLOR3FPROC)glfwGetProcAddress("glSecondaryColor3f");
            glad_glSecondaryColor3fv =
                 (PFNGLSECONDARYCOLOR3FVPROC)glfwGetProcAddress("glSecondaryColor3fv");
            glad_glSecondaryColor3i =
                 (PFNGLSECONDARYCOLOR3IPROC)glfwGetProcAddress("glSecondaryColor3i");
            glad_glSecondaryColor3iv =
                 (PFNGLSECONDARYCOLOR3IVPROC)glfwGetProcAddress("glSecondaryColor3iv");
            glad_glSecondaryColor3s =
                 (PFNGLSECONDARYCOLOR3SPROC)glfwGetProcAddress("glSecondaryColor3s");
            glad_glSecondaryColor3sv =
                 (PFNGLSECONDARYCOLOR3SVPROC)glfwGetProcAddress("glSecondaryColor3sv");
            glad_glSecondaryColor3ub =
                 (PFNGLSECONDARYCOLOR3UBPROC)glfwGetProcAddress("glSecondaryColor3ub");
            glad_glSecondaryColor3ubv =
                 (PFNGLSECONDARYCOLOR3UBVPROC)glfwGetProcAddress("glSecondaryColor3ubv");
            glad_glSecondaryColor3ui =
                 (PFNGLSECONDARYCOLOR3UIPROC)glfwGetProcAddress("glSecondaryColor3ui");
            glad_glSecondaryColor3uiv =
                 (PFNGLSECONDARYCOLOR3UIVPROC)glfwGetProcAddress("glSecondaryColor3uiv");
            glad_glSecondaryColor3us =
                 (PFNGLSECONDARYCOLOR3USPROC)glfwGetProcAddress("glSecondaryColor3us");
            glad_glSecondaryColor3usv =
                 (PFNGLSECONDARYCOLOR3USVPROC)glfwGetProcAddress("glSecondaryColor3usv");
            glad_glSecondaryColorPointer =
                 (PFNGLSECONDARYCOLORPOINTERPROC)glfwGetProcAddress("glSecondaryColorPointer");
            glad_glWindowPos2d = (PFNGLWINDOWPOS2DPROC)glfwGetProcAddress("glWindowPos2d");
            glad_glWindowPos2dv = (PFNGLWINDOWPOS2DVPROC)glfwGetProcAddress("glWindowPos2dv");
            glad_glWindowPos2f = (PFNGLWINDOWPOS2FPROC)glfwGetProcAddress("glWindowPos2f");
            glad_glWindowPos2fv = (PFNGLWINDOWPOS2FVPROC)glfwGetProcAddress("glWindowPos2fv");
            glad_glWindowPos2i = (PFNGLWINDOWPOS2IPROC)glfwGetProcAddress("glWindowPos2i");
            glad_glWindowPos2iv = (PFNGLWINDOWPOS2IVPROC)glfwGetProcAddress("glWindowPos2iv");
            glad_glWindowPos2s = (PFNGLWINDOWPOS2SPROC)glfwGetProcAddress("glWindowPos2s");
            glad_glWindowPos2sv = (PFNGLWINDOWPOS2SVPROC)glfwGetProcAddress("glWindowPos2sv");
            glad_glWindowPos3d = (PFNGLWINDOWPOS3DPROC)glfwGetProcAddress("glWindowPos3d");
            glad_glWindowPos3dv = (PFNGLWINDOWPOS3DVPROC)glfwGetProcAddress("glWindowPos3dv");
            glad_glWindowPos3f = (PFNGLWINDOWPOS3FPROC)glfwGetProcAddress("glWindowPos3f");
            glad_glWindowPos3fv = (PFNGLWINDOWPOS3FVPROC)glfwGetProcAddress("glWindowPos3fv");
            glad_glWindowPos3i = (PFNGLWINDOWPOS3IPROC)glfwGetProcAddress("glWindowPos3i");
            glad_glWindowPos3iv = (PFNGLWINDOWPOS3IVPROC)glfwGetProcAddress("glWindowPos3iv");
            glad_glWindowPos3s = (PFNGLWINDOWPOS3SPROC)glfwGetProcAddress("glWindowPos3s");
            glad_glWindowPos3sv = (PFNGLWINDOWPOS3SVPROC)glfwGetProcAddress("glWindowPos3sv");
          }
          if (GLAD_GL_VERSION_1_5 != 0) {
            glad_glBeginQuery = (PFNGLBEGINQUERYPROC)glfwGetProcAddress("glBeginQuery");
            glad_glBindBuffer = (PFNGLBINDBUFFERPROC)glfwGetProcAddress("glBindBuffer");
            glad_glBufferData = (PFNGLBUFFERDATAPROC)glfwGetProcAddress("glBufferData");
            glad_glBufferSubData = (PFNGLBUFFERSUBDATAPROC)glfwGetProcAddress("glBufferSubData");
            glad_glDeleteBuffers = (PFNGLDELETEBUFFERSPROC)glfwGetProcAddress("glDeleteBuffers");
            glad_glDeleteQueries = (PFNGLDELETEQUERIESPROC)glfwGetProcAddress("glDeleteQueries");
            glad_glEndQuery = (PFNGLENDQUERYPROC)glfwGetProcAddress("glEndQuery");
            glad_glGenBuffers = (PFNGLGENBUFFERSPROC)glfwGetProcAddress("glGenBuffers");
            glad_glGenQueries = (PFNGLGENQUERIESPROC)glfwGetProcAddress("glGenQueries");
            glad_glGetBufferParameteriv =
                 (PFNGLGETBUFFERPARAMETERIVPROC)glfwGetProcAddress("glGetBufferParameteriv");
            glad_glGetBufferPointerv =
                 (PFNGLGETBUFFERPOINTERVPROC)glfwGetProcAddress("glGetBufferPointerv");
            glad_glGetBufferSubData =
                 (PFNGLGETBUFFERSUBDATAPROC)glfwGetProcAddress("glGetBufferSubData");
            glad_glGetQueryObjectiv =
                 (PFNGLGETQUERYOBJECTIVPROC)glfwGetProcAddress("glGetQueryObjectiv");
            glad_glGetQueryObjectuiv =
                 (PFNGLGETQUERYOBJECTUIVPROC)glfwGetProcAddress("glGetQueryObjectuiv");
            glad_glGetQueryiv = (PFNGLGETQUERYIVPROC)glfwGetProcAddress("glGetQueryiv");
            glad_glIsBuffer = (PFNGLISBUFFERPROC)glfwGetProcAddress("glIsBuffer");
            glad_glIsQuery = (PFNGLISQUERYPROC)glfwGetProcAddress("glIsQuery");
            glad_glMapBuffer = (PFNGLMAPBUFFERPROC)glfwGetProcAddress("glMapBuffer");
            glad_glUnmapBuffer = (PFNGLUNMAPBUFFERPROC)glfwGetProcAddress("glUnmapBuffer");
          }
          if (GLAD_GL_VERSION_2_0 != 0) {
            glad_glAttachShader = (PFNGLATTACHSHADERPROC)glfwGetProcAddress("glAttachShader");
            glad_glBindAttribLocation =
                 (PFNGLBINDATTRIBLOCATIONPROC)glfwGetProcAddress("glBindAttribLocation");
            glad_glBlendEquationSeparate =
                 (PFNGLBLENDEQUATIONSEPARATEPROC)glfwGetProcAddress("glBlendEquationSeparate");
            glad_glCompileShader = (PFNGLCOMPILESHADERPROC)glfwGetProcAddress("glCompileShader");
            glad_glCreateProgram = (PFNGLCREATEPROGRAMPROC)glfwGetProcAddress("glCreateProgram");
            glad_glCreateShader = (PFNGLCREATESHADERPROC)glfwGetProcAddress("glCreateShader");
            glad_glDeleteProgram = (PFNGLDELETEPROGRAMPROC)glfwGetProcAddress("glDeleteProgram");
            glad_glDeleteShader = (PFNGLDELETESHADERPROC)glfwGetProcAddress("glDeleteShader");
            glad_glDetachShader = (PFNGLDETACHSHADERPROC)glfwGetProcAddress("glDetachShader");
            glad_glDisableVertexAttribArray =
                 (PFNGLDISABLEVERTEXATTRIBARRAYPROC)glfwGetProcAddress("glDisableVertexAttribArray")
            ;
            glad_glDrawBuffers = (PFNGLDRAWBUFFERSPROC)glfwGetProcAddress("glDrawBuffers");
            glad_glEnableVertexAttribArray =
                 (PFNGLENABLEVERTEXATTRIBARRAYPROC)glfwGetProcAddress("glEnableVertexAttribArray");
            glad_glGetActiveAttrib =
                 (PFNGLGETACTIVEATTRIBPROC)glfwGetProcAddress("glGetActiveAttrib");
            glad_glGetActiveUniform =
                 (PFNGLGETACTIVEUNIFORMPROC)glfwGetProcAddress("glGetActiveUniform");
            glad_glGetAttachedShaders =
                 (PFNGLGETATTACHEDSHADERSPROC)glfwGetProcAddress("glGetAttachedShaders");
            glad_glGetAttribLocation =
                 (PFNGLGETATTRIBLOCATIONPROC)glfwGetProcAddress("glGetAttribLocation");
            glad_glGetProgramInfoLog =
                 (PFNGLGETPROGRAMINFOLOGPROC)glfwGetProcAddress("glGetProgramInfoLog");
            glad_glGetProgramiv = (PFNGLGETPROGRAMIVPROC)glfwGetProcAddress("glGetProgramiv");
            glad_glGetShaderInfoLog =
                 (PFNGLGETSHADERINFOLOGPROC)glfwGetProcAddress("glGetShaderInfoLog");
            glad_glGetShaderSource =
                 (PFNGLGETSHADERSOURCEPROC)glfwGetProcAddress("glGetShaderSource");
            glad_glGetShaderiv = (PFNGLGETSHADERIVPROC)glfwGetProcAddress("glGetShaderiv");
            glad_glGetUniformLocation =
                 (PFNGLGETUNIFORMLOCATIONPROC)glfwGetProcAddress("glGetUniformLocation");
            glad_glGetUniformfv = (PFNGLGETUNIFORMFVPROC)glfwGetProcAddress("glGetUniformfv");
            glad_glGetUniformiv = (PFNGLGETUNIFORMIVPROC)glfwGetProcAddress("glGetUniformiv");
            glad_glGetVertexAttribPointerv =
                 (PFNGLGETVERTEXATTRIBPOINTERVPROC)glfwGetProcAddress("glGetVertexAttribPointerv");
            glad_glGetVertexAttribdv =
                 (PFNGLGETVERTEXATTRIBDVPROC)glfwGetProcAddress("glGetVertexAttribdv");
            glad_glGetVertexAttribfv =
                 (PFNGLGETVERTEXATTRIBFVPROC)glfwGetProcAddress("glGetVertexAttribfv");
            glad_glGetVertexAttribiv =
                 (PFNGLGETVERTEXATTRIBIVPROC)glfwGetProcAddress("glGetVertexAttribiv");
            glad_glIsProgram = (PFNGLISPROGRAMPROC)glfwGetProcAddress("glIsProgram");
            glad_glIsShader = (PFNGLISSHADERPROC)glfwGetProcAddress("glIsShader");
            glad_glLinkProgram = (PFNGLLINKPROGRAMPROC)glfwGetProcAddress("glLinkProgram");
            glad_glShaderSource = (PFNGLSHADERSOURCEPROC)glfwGetProcAddress("glShaderSource");
            glad_glStencilFuncSeparate =
                 (PFNGLSTENCILFUNCSEPARATEPROC)glfwGetProcAddress("glStencilFuncSeparate");
            glad_glStencilMaskSeparate =
                 (PFNGLSTENCILMASKSEPARATEPROC)glfwGetProcAddress("glStencilMaskSeparate");
            glad_glStencilOpSeparate =
                 (PFNGLSTENCILOPSEPARATEPROC)glfwGetProcAddress("glStencilOpSeparate");
            glad_glUniform1f = (PFNGLUNIFORM1FPROC)glfwGetProcAddress("glUniform1f");
            glad_glUniform1fv = (PFNGLUNIFORM1FVPROC)glfwGetProcAddress("glUniform1fv");
            glad_glUniform1i = (PFNGLUNIFORM1IPROC)glfwGetProcAddress("glUniform1i");
            glad_glUniform1iv = (PFNGLUNIFORM1IVPROC)glfwGetProcAddress("glUniform1iv");
            glad_glUniform2f = (PFNGLUNIFORM2FPROC)glfwGetProcAddress("glUniform2f");
            glad_glUniform2fv = (PFNGLUNIFORM2FVPROC)glfwGetProcAddress("glUniform2fv");
            glad_glUniform2i = (PFNGLUNIFORM2IPROC)glfwGetProcAddress("glUniform2i");
            glad_glUniform2iv = (PFNGLUNIFORM2IVPROC)glfwGetProcAddress("glUniform2iv");
            glad_glUniform3f = (PFNGLUNIFORM3FPROC)glfwGetProcAddress("glUniform3f");
            glad_glUniform3fv = (PFNGLUNIFORM3FVPROC)glfwGetProcAddress("glUniform3fv");
            glad_glUniform3i = (PFNGLUNIFORM3IPROC)glfwGetProcAddress("glUniform3i");
            glad_glUniform3iv = (PFNGLUNIFORM3IVPROC)glfwGetProcAddress("glUniform3iv");
            glad_glUniform4f = (PFNGLUNIFORM4FPROC)glfwGetProcAddress("glUniform4f");
            glad_glUniform4fv = (PFNGLUNIFORM4FVPROC)glfwGetProcAddress("glUniform4fv");
            glad_glUniform4i = (PFNGLUNIFORM4IPROC)glfwGetProcAddress("glUniform4i");
            glad_glUniform4iv = (PFNGLUNIFORM4IVPROC)glfwGetProcAddress("glUniform4iv");
            glad_glUniformMatrix2fv =
                 (PFNGLUNIFORMMATRIX2FVPROC)glfwGetProcAddress("glUniformMatrix2fv");
            glad_glUniformMatrix3fv =
                 (PFNGLUNIFORMMATRIX3FVPROC)glfwGetProcAddress("glUniformMatrix3fv");
            glad_glUniformMatrix4fv =
                 (PFNGLUNIFORMMATRIX4FVPROC)glfwGetProcAddress("glUniformMatrix4fv");
            glad_glUseProgram = (PFNGLUSEPROGRAMPROC)glfwGetProcAddress("glUseProgram");
            glad_glValidateProgram =
                 (PFNGLVALIDATEPROGRAMPROC)glfwGetProcAddress("glValidateProgram");
            glad_glVertexAttrib1d = (PFNGLVERTEXATTRIB1DPROC)glfwGetProcAddress("glVertexAttrib1d");
            glad_glVertexAttrib1dv =
                 (PFNGLVERTEXATTRIB1DVPROC)glfwGetProcAddress("glVertexAttrib1dv");
            glad_glVertexAttrib1f = (PFNGLVERTEXATTRIB1FPROC)glfwGetProcAddress("glVertexAttrib1f");
            glad_glVertexAttrib1fv =
                 (PFNGLVERTEXATTRIB1FVPROC)glfwGetProcAddress("glVertexAttrib1fv");
            glad_glVertexAttrib1s = (PFNGLVERTEXATTRIB1SPROC)glfwGetProcAddress("glVertexAttrib1s");
            glad_glVertexAttrib1sv =
                 (PFNGLVERTEXATTRIB1SVPROC)glfwGetProcAddress("glVertexAttrib1sv");
            glad_glVertexAttrib2d = (PFNGLVERTEXATTRIB2DPROC)glfwGetProcAddress("glVertexAttrib2d");
            glad_glVertexAttrib2dv =
                 (PFNGLVERTEXATTRIB2DVPROC)glfwGetProcAddress("glVertexAttrib2dv");
            glad_glVertexAttrib2f = (PFNGLVERTEXATTRIB2FPROC)glfwGetProcAddress("glVertexAttrib2f");
            glad_glVertexAttrib2fv =
                 (PFNGLVERTEXATTRIB2FVPROC)glfwGetProcAddress("glVertexAttrib2fv");
            glad_glVertexAttrib2s = (PFNGLVERTEXATTRIB2SPROC)glfwGetProcAddress("glVertexAttrib2s");
            glad_glVertexAttrib2sv =
                 (PFNGLVERTEXATTRIB2SVPROC)glfwGetProcAddress("glVertexAttrib2sv");
            glad_glVertexAttrib3d = (PFNGLVERTEXATTRIB3DPROC)glfwGetProcAddress("glVertexAttrib3d");
            glad_glVertexAttrib3dv =
                 (PFNGLVERTEXATTRIB3DVPROC)glfwGetProcAddress("glVertexAttrib3dv");
            glad_glVertexAttrib3f = (PFNGLVERTEXATTRIB3FPROC)glfwGetProcAddress("glVertexAttrib3f");
            glad_glVertexAttrib3fv =
                 (PFNGLVERTEXATTRIB3FVPROC)glfwGetProcAddress("glVertexAttrib3fv");
            glad_glVertexAttrib3s = (PFNGLVERTEXATTRIB3SPROC)glfwGetProcAddress("glVertexAttrib3s");
            glad_glVertexAttrib3sv =
                 (PFNGLVERTEXATTRIB3SVPROC)glfwGetProcAddress("glVertexAttrib3sv");
            glad_glVertexAttrib4Nbv =
                 (PFNGLVERTEXATTRIB4NBVPROC)glfwGetProcAddress("glVertexAttrib4Nbv");
            glad_glVertexAttrib4Niv =
                 (PFNGLVERTEXATTRIB4NIVPROC)glfwGetProcAddress("glVertexAttrib4Niv");
            glad_glVertexAttrib4Nsv =
                 (PFNGLVERTEXATTRIB4NSVPROC)glfwGetProcAddress("glVertexAttrib4Nsv");
            glad_glVertexAttrib4Nub =
                 (PFNGLVERTEXATTRIB4NUBPROC)glfwGetProcAddress("glVertexAttrib4Nub");
            glad_glVertexAttrib4Nubv =
                 (PFNGLVERTEXATTRIB4NUBVPROC)glfwGetProcAddress("glVertexAttrib4Nubv");
            glad_glVertexAttrib4Nuiv =
                 (PFNGLVERTEXATTRIB4NUIVPROC)glfwGetProcAddress("glVertexAttrib4Nuiv");
            glad_glVertexAttrib4Nusv =
                 (PFNGLVERTEXATTRIB4NUSVPROC)glfwGetProcAddress("glVertexAttrib4Nusv");
            glad_glVertexAttrib4bv =
                 (PFNGLVERTEXATTRIB4BVPROC)glfwGetProcAddress("glVertexAttrib4bv");
            glad_glVertexAttrib4d = (PFNGLVERTEXATTRIB4DPROC)glfwGetProcAddress("glVertexAttrib4d");
            glad_glVertexAttrib4dv =
                 (PFNGLVERTEXATTRIB4DVPROC)glfwGetProcAddress("glVertexAttrib4dv");
            glad_glVertexAttrib4f = (PFNGLVERTEXATTRIB4FPROC)glfwGetProcAddress("glVertexAttrib4f");
            glad_glVertexAttrib4fv =
                 (PFNGLVERTEXATTRIB4FVPROC)glfwGetProcAddress("glVertexAttrib4fv");
            glad_glVertexAttrib4iv =
                 (PFNGLVERTEXATTRIB4IVPROC)glfwGetProcAddress("glVertexAttrib4iv");
            glad_glVertexAttrib4s = (PFNGLVERTEXATTRIB4SPROC)glfwGetProcAddress("glVertexAttrib4s");
            glad_glVertexAttrib4sv =
                 (PFNGLVERTEXATTRIB4SVPROC)glfwGetProcAddress("glVertexAttrib4sv");
            glad_glVertexAttrib4ubv =
                 (PFNGLVERTEXATTRIB4UBVPROC)glfwGetProcAddress("glVertexAttrib4ubv");
            glad_glVertexAttrib4uiv =
                 (PFNGLVERTEXATTRIB4UIVPROC)glfwGetProcAddress("glVertexAttrib4uiv");
            glad_glVertexAttrib4usv =
                 (PFNGLVERTEXATTRIB4USVPROC)glfwGetProcAddress("glVertexAttrib4usv");
            glad_glVertexAttribPointer =
                 (PFNGLVERTEXATTRIBPOINTERPROC)glfwGetProcAddress("glVertexAttribPointer");
          }
          if (GLAD_GL_VERSION_2_1 != 0) {
            glad_glUniformMatrix2x3fv =
                 (PFNGLUNIFORMMATRIX2X3FVPROC)glfwGetProcAddress("glUniformMatrix2x3fv");
            glad_glUniformMatrix2x4fv =
                 (PFNGLUNIFORMMATRIX2X4FVPROC)glfwGetProcAddress("glUniformMatrix2x4fv");
            glad_glUniformMatrix3x2fv =
                 (PFNGLUNIFORMMATRIX3X2FVPROC)glfwGetProcAddress("glUniformMatrix3x2fv");
            glad_glUniformMatrix3x4fv =
                 (PFNGLUNIFORMMATRIX3X4FVPROC)glfwGetProcAddress("glUniformMatrix3x4fv");
            glad_glUniformMatrix4x2fv =
                 (PFNGLUNIFORMMATRIX4X2FVPROC)glfwGetProcAddress("glUniformMatrix4x2fv");
            glad_glUniformMatrix4x3fv =
                 (PFNGLUNIFORMMATRIX4X3FVPROC)glfwGetProcAddress("glUniformMatrix4x3fv");
          }
          if (GLAD_GL_VERSION_3_0 != 0) {
            glad_glBeginConditionalRender =
                 (PFNGLBEGINCONDITIONALRENDERPROC)glfwGetProcAddress("glBeginConditionalRender");
            glad_glBeginTransformFeedback =
                 (PFNGLBEGINTRANSFORMFEEDBACKPROC)glfwGetProcAddress("glBeginTransformFeedback");
            glad_glBindBufferBase = (PFNGLBINDBUFFERBASEPROC)glfwGetProcAddress("glBindBufferBase");
            glad_glBindBufferRange =
                 (PFNGLBINDBUFFERRANGEPROC)glfwGetProcAddress("glBindBufferRange");
            glad_glBindFragDataLocation =
                 (PFNGLBINDFRAGDATALOCATIONPROC)glfwGetProcAddress("glBindFragDataLocation");
            glad_glBindFramebuffer =
                 (PFNGLBINDFRAMEBUFFERPROC)glfwGetProcAddress("glBindFramebuffer");
            glad_glBindRenderbuffer =
                 (PFNGLBINDRENDERBUFFERPROC)glfwGetProcAddress("glBindRenderbuffer");
            glad_glBindVertexArray =
                 (PFNGLBINDVERTEXARRAYPROC)glfwGetProcAddress("glBindVertexArray");
            glad_glBlitFramebuffer =
                 (PFNGLBLITFRAMEBUFFERPROC)glfwGetProcAddress("glBlitFramebuffer");
            glad_glCheckFramebufferStatus =
                 (PFNGLCHECKFRAMEBUFFERSTATUSPROC)glfwGetProcAddress("glCheckFramebufferStatus");
            glad_glClampColor = (PFNGLCLAMPCOLORPROC)glfwGetProcAddress("glClampColor");
            glad_glClearBufferfi = (PFNGLCLEARBUFFERFIPROC)glfwGetProcAddress("glClearBufferfi");
            glad_glClearBufferfv = (PFNGLCLEARBUFFERFVPROC)glfwGetProcAddress("glClearBufferfv");
            glad_glClearBufferiv = (PFNGLCLEARBUFFERIVPROC)glfwGetProcAddress("glClearBufferiv");
            glad_glClearBufferuiv = (PFNGLCLEARBUFFERUIVPROC)glfwGetProcAddress("glClearBufferuiv");
            glad_glColorMaski = (PFNGLCOLORMASKIPROC)glfwGetProcAddress("glColorMaski");
            glad_glDeleteFramebuffers =
                 (PFNGLDELETEFRAMEBUFFERSPROC)glfwGetProcAddress("glDeleteFramebuffers");
            glad_glDeleteRenderbuffers =
                 (PFNGLDELETERENDERBUFFERSPROC)glfwGetProcAddress("glDeleteRenderbuffers");
            glad_glDeleteVertexArrays =
                 (PFNGLDELETEVERTEXARRAYSPROC)glfwGetProcAddress("glDeleteVertexArrays");
            glad_glDisablei = (PFNGLDISABLEIPROC)glfwGetProcAddress("glDisablei");
            glad_glEnablei = (PFNGLENABLEIPROC)glfwGetProcAddress("glEnablei");
            glad_glEndConditionalRender = glfwGetProcAddress("glEndConditionalRender");
            glad_glEndTransformFeedback = glfwGetProcAddress("glEndTransformFeedback");
            glad_glFlushMappedBufferRange =
                 (PFNGLFLUSHMAPPEDBUFFERRANGEPROC)glfwGetProcAddress("glFlushMappedBufferRange");
            glad_glFramebufferRenderbuffer =
                 (PFNGLFRAMEBUFFERRENDERBUFFERPROC)glfwGetProcAddress("glFramebufferRenderbuffer");
            glad_glFramebufferTexture1D =
                 (PFNGLFRAMEBUFFERTEXTURE1DPROC)glfwGetProcAddress("glFramebufferTexture1D");
            glad_glFramebufferTexture2D =
                 (PFNGLFRAMEBUFFERTEXTURE2DPROC)glfwGetProcAddress("glFramebufferTexture2D");
            glad_glFramebufferTexture3D =
                 (PFNGLFRAMEBUFFERTEXTURE3DPROC)glfwGetProcAddress("glFramebufferTexture3D");
            glad_glFramebufferTextureLayer =
                 (PFNGLFRAMEBUFFERTEXTURELAYERPROC)glfwGetProcAddress("glFramebufferTextureLayer");
            glad_glGenFramebuffers =
                 (PFNGLGENFRAMEBUFFERSPROC)glfwGetProcAddress("glGenFramebuffers");
            glad_glGenRenderbuffers =
                 (PFNGLGENRENDERBUFFERSPROC)glfwGetProcAddress("glGenRenderbuffers");
            glad_glGenVertexArrays =
                 (PFNGLGENVERTEXARRAYSPROC)glfwGetProcAddress("glGenVertexArrays");
            glad_glGenerateMipmap = (PFNGLGENERATEMIPMAPPROC)glfwGetProcAddress("glGenerateMipmap");
            glad_glGetBooleani_v = (PFNGLGETBOOLEANI_VPROC)glfwGetProcAddress("glGetBooleani_v");
            glad_glGetFragDataLocation =
                 (PFNGLGETFRAGDATALOCATIONPROC)glfwGetProcAddress("glGetFragDataLocation");
            glad_glGetFramebufferAttachmentParameteriv =
                 (PFNGLGETFRAMEBUFFERATTACHMENTPARAMETERIVPROC)
                 glfwGetProcAddress("glGetFramebufferAttachmentParameteriv");
            glad_glGetIntegeri_v = (PFNGLGETINTEGERI_VPROC)glfwGetProcAddress("glGetIntegeri_v");
            glad_glGetRenderbufferParameteriv =
                 (PFNGLGETRENDERBUFFERPARAMETERIVPROC)
                 glfwGetProcAddress("glGetRenderbufferParameteriv");
            glad_glGetStringi = (PFNGLGETSTRINGIPROC)glfwGetProcAddress("glGetStringi");
            glad_glGetTexParameterIiv =
                 (PFNGLGETTEXPARAMETERIIVPROC)glfwGetProcAddress("glGetTexParameterIiv");
            glad_glGetTexParameterIuiv =
                 (PFNGLGETTEXPARAMETERIUIVPROC)glfwGetProcAddress("glGetTexParameterIuiv");
            glad_glGetTransformFeedbackVarying =
                 (PFNGLGETTRANSFORMFEEDBACKVARYINGPROC)
                 glfwGetProcAddress("glGetTransformFeedbackVarying");
            glad_glGetUniformuiv = (PFNGLGETUNIFORMUIVPROC)glfwGetProcAddress("glGetUniformuiv");
            glad_glGetVertexAttribIiv =
                 (PFNGLGETVERTEXATTRIBIIVPROC)glfwGetProcAddress("glGetVertexAttribIiv");
            glad_glGetVertexAttribIuiv =
                 (PFNGLGETVERTEXATTRIBIUIVPROC)glfwGetProcAddress("glGetVertexAttribIuiv");
            glad_glIsEnabledi = (PFNGLISENABLEDIPROC)glfwGetProcAddress("glIsEnabledi");
            glad_glIsFramebuffer = (PFNGLISFRAMEBUFFERPROC)glfwGetProcAddress("glIsFramebuffer");
            glad_glIsRenderbuffer = (PFNGLISRENDERBUFFERPROC)glfwGetProcAddress("glIsRenderbuffer");
            glad_glIsVertexArray = (PFNGLISVERTEXARRAYPROC)glfwGetProcAddress("glIsVertexArray");
            glad_glMapBufferRange = (PFNGLMAPBUFFERRANGEPROC)glfwGetProcAddress("glMapBufferRange");
            glad_glRenderbufferStorage =
                 (PFNGLRENDERBUFFERSTORAGEPROC)glfwGetProcAddress("glRenderbufferStorage");
            glad_glRenderbufferStorageMultisample =
                 (PFNGLRENDERBUFFERSTORAGEMULTISAMPLEPROC)
                 glfwGetProcAddress("glRenderbufferStorageMultisample");
            glad_glTexParameterIiv =
                 (PFNGLTEXPARAMETERIIVPROC)glfwGetProcAddress("glTexParameterIiv");
            glad_glTexParameterIuiv =
                 (PFNGLTEXPARAMETERIUIVPROC)glfwGetProcAddress("glTexParameterIuiv");
            glad_glTransformFeedbackVaryings =
                 (PFNGLTRANSFORMFEEDBACKVARYINGSPROC)
                 glfwGetProcAddress("glTransformFeedbackVaryings");
            glad_glUniform1ui = (PFNGLUNIFORM1UIPROC)glfwGetProcAddress("glUniform1ui");
            glad_glUniform1uiv = (PFNGLUNIFORM1UIVPROC)glfwGetProcAddress("glUniform1uiv");
            glad_glUniform2ui = (PFNGLUNIFORM2UIPROC)glfwGetProcAddress("glUniform2ui");
            glad_glUniform2uiv = (PFNGLUNIFORM2UIVPROC)glfwGetProcAddress("glUniform2uiv");
            glad_glUniform3ui = (PFNGLUNIFORM3UIPROC)glfwGetProcAddress("glUniform3ui");
            glad_glUniform3uiv = (PFNGLUNIFORM3UIVPROC)glfwGetProcAddress("glUniform3uiv");
            glad_glUniform4ui = (PFNGLUNIFORM4UIPROC)glfwGetProcAddress("glUniform4ui");
            glad_glUniform4uiv = (PFNGLUNIFORM4UIVPROC)glfwGetProcAddress("glUniform4uiv");
            glad_glVertexAttribI1i =
                 (PFNGLVERTEXATTRIBI1IPROC)glfwGetProcAddress("glVertexAttribI1i");
            glad_glVertexAttribI1iv =
                 (PFNGLVERTEXATTRIBI1IVPROC)glfwGetProcAddress("glVertexAttribI1iv");
            glad_glVertexAttribI1ui =
                 (PFNGLVERTEXATTRIBI1UIPROC)glfwGetProcAddress("glVertexAttribI1ui");
            glad_glVertexAttribI1uiv =
                 (PFNGLVERTEXATTRIBI1UIVPROC)glfwGetProcAddress("glVertexAttribI1uiv");
            glad_glVertexAttribI2i =
                 (PFNGLVERTEXATTRIBI2IPROC)glfwGetProcAddress("glVertexAttribI2i");
            glad_glVertexAttribI2iv =
                 (PFNGLVERTEXATTRIBI2IVPROC)glfwGetProcAddress("glVertexAttribI2iv");
            glad_glVertexAttribI2ui =
                 (PFNGLVERTEXATTRIBI2UIPROC)glfwGetProcAddress("glVertexAttribI2ui");
            glad_glVertexAttribI2uiv =
                 (PFNGLVERTEXATTRIBI2UIVPROC)glfwGetProcAddress("glVertexAttribI2uiv");
            glad_glVertexAttribI3i =
                 (PFNGLVERTEXATTRIBI3IPROC)glfwGetProcAddress("glVertexAttribI3i");
            glad_glVertexAttribI3iv =
                 (PFNGLVERTEXATTRIBI3IVPROC)glfwGetProcAddress("glVertexAttribI3iv");
            glad_glVertexAttribI3ui =
                 (PFNGLVERTEXATTRIBI3UIPROC)glfwGetProcAddress("glVertexAttribI3ui");
            glad_glVertexAttribI3uiv =
                 (PFNGLVERTEXATTRIBI3UIVPROC)glfwGetProcAddress("glVertexAttribI3uiv");
            glad_glVertexAttribI4bv =
                 (PFNGLVERTEXATTRIBI4BVPROC)glfwGetProcAddress("glVertexAttribI4bv");
            glad_glVertexAttribI4i =
                 (PFNGLVERTEXATTRIBI4IPROC)glfwGetProcAddress("glVertexAttribI4i");
            glad_glVertexAttribI4iv =
                 (PFNGLVERTEXATTRIBI4IVPROC)glfwGetProcAddress("glVertexAttribI4iv");
            glad_glVertexAttribI4sv =
                 (PFNGLVERTEXATTRIBI4SVPROC)glfwGetProcAddress("glVertexAttribI4sv");
            glad_glVertexAttribI4ubv =
                 (PFNGLVERTEXATTRIBI4UBVPROC)glfwGetProcAddress("glVertexAttribI4ubv");
            glad_glVertexAttribI4ui =
                 (PFNGLVERTEXATTRIBI4UIPROC)glfwGetProcAddress("glVertexAttribI4ui");
            glad_glVertexAttribI4uiv =
                 (PFNGLVERTEXATTRIBI4UIVPROC)glfwGetProcAddress("glVertexAttribI4uiv");
            glad_glVertexAttribI4usv =
                 (PFNGLVERTEXATTRIBI4USVPROC)glfwGetProcAddress("glVertexAttribI4usv");
            glad_glVertexAttribIPointer =
                 (PFNGLVERTEXATTRIBIPOINTERPROC)glfwGetProcAddress("glVertexAttribIPointer");
          }
          if (GLAD_GL_VERSION_3_1 != 0) {
            glad_glBindBufferBase = (PFNGLBINDBUFFERBASEPROC)glfwGetProcAddress("glBindBufferBase");
            glad_glBindBufferRange =
                 (PFNGLBINDBUFFERRANGEPROC)glfwGetProcAddress("glBindBufferRange");
            glad_glCopyBufferSubData =
                 (PFNGLCOPYBUFFERSUBDATAPROC)glfwGetProcAddress("glCopyBufferSubData");
            glad_glDrawArraysInstanced =
                 (PFNGLDRAWARRAYSINSTANCEDPROC)glfwGetProcAddress("glDrawArraysInstanced");
            glad_glDrawElementsInstanced =
                 (PFNGLDRAWELEMENTSINSTANCEDPROC)glfwGetProcAddress("glDrawElementsInstanced");
            glad_glGetActiveUniformBlockName =
                 (PFNGLGETACTIVEUNIFORMBLOCKNAMEPROC)
                 glfwGetProcAddress("glGetActiveUniformBlockName");
            glad_glGetActiveUniformBlockiv =
                 (PFNGLGETACTIVEUNIFORMBLOCKIVPROC)glfwGetProcAddress("glGetActiveUniformBlockiv");
            glad_glGetActiveUniformName =
                 (PFNGLGETACTIVEUNIFORMNAMEPROC)glfwGetProcAddress("glGetActiveUniformName");
            glad_glGetActiveUniformsiv =
                 (PFNGLGETACTIVEUNIFORMSIVPROC)glfwGetProcAddress("glGetActiveUniformsiv");
            glad_glGetIntegeri_v = (PFNGLGETINTEGERI_VPROC)glfwGetProcAddress("glGetIntegeri_v");
            glad_glGetUniformBlockIndex =
                 (PFNGLGETUNIFORMBLOCKINDEXPROC)glfwGetProcAddress("glGetUniformBlockIndex");
            glad_glGetUniformIndices =
                 (PFNGLGETUNIFORMINDICESPROC)glfwGetProcAddress("glGetUniformIndices");
            glad_glPrimitiveRestartIndex =
                 (PFNGLPRIMITIVERESTARTINDEXPROC)glfwGetProcAddress("glPrimitiveRestartIndex");
            glad_glTexBuffer = (PFNGLTEXBUFFERPROC)glfwGetProcAddress("glTexBuffer");
            glad_glUniformBlockBinding =
                 (PFNGLUNIFORMBLOCKBINDINGPROC)glfwGetProcAddress("glUniformBlockBinding");
          }
          if (GLAD_GL_VERSION_3_2 != 0) {
            glad_glClientWaitSync = (PFNGLCLIENTWAITSYNCPROC)glfwGetProcAddress("glClientWaitSync");
            glad_glDeleteSync = (PFNGLDELETESYNCPROC)glfwGetProcAddress("glDeleteSync");
            glad_glDrawElementsBaseVertex =
                 (PFNGLDRAWELEMENTSBASEVERTEXPROC)glfwGetProcAddress("glDrawElementsBaseVertex");
            glad_glDrawElementsInstancedBaseVertex =
                 (PFNGLDRAWELEMENTSINSTANCEDBASEVERTEXPROC)
                 glfwGetProcAddress("glDrawElementsInstancedBaseVertex");
            glad_glDrawRangeElementsBaseVertex =
                 (PFNGLDRAWRANGEELEMENTSBASEVERTEXPROC)
                 glfwGetProcAddress("glDrawRangeElementsBaseVertex");
            glad_glFenceSync = (PFNGLFENCESYNCPROC)glfwGetProcAddress("glFenceSync");
            glad_glFramebufferTexture =
                 (PFNGLFRAMEBUFFERTEXTUREPROC)glfwGetProcAddress("glFramebufferTexture");
            glad_glGetBufferParameteri64v =
                 (PFNGLGETBUFFERPARAMETERI64VPROC)glfwGetProcAddress("glGetBufferParameteri64v");
            glad_glGetInteger64i_v =
                 (PFNGLGETINTEGER64I_VPROC)glfwGetProcAddress("glGetInteger64i_v");
            glad_glGetInteger64v = (PFNGLGETINTEGER64VPROC)glfwGetProcAddress("glGetInteger64v");
            glad_glGetMultisamplefv =
                 (PFNGLGETMULTISAMPLEFVPROC)glfwGetProcAddress("glGetMultisamplefv");
            glad_glGetSynciv = (PFNGLGETSYNCIVPROC)glfwGetProcAddress("glGetSynciv");
            glad_glIsSync = (PFNGLISSYNCPROC)glfwGetProcAddress("glIsSync");
            glad_glMultiDrawElementsBaseVertex =
                 (PFNGLMULTIDRAWELEMENTSBASEVERTEXPROC)
                 glfwGetProcAddress("glMultiDrawElementsBaseVertex");
            glad_glProvokingVertex =
                 (PFNGLPROVOKINGVERTEXPROC)glfwGetProcAddress("glProvokingVertex");
            glad_glSampleMaski = (PFNGLSAMPLEMASKIPROC)glfwGetProcAddress("glSampleMaski");
            glad_glTexImage2DMultisample =
                 (PFNGLTEXIMAGE2DMULTISAMPLEPROC)glfwGetProcAddress("glTexImage2DMultisample");
            glad_glTexImage3DMultisample =
                 (PFNGLTEXIMAGE3DMULTISAMPLEPROC)glfwGetProcAddress("glTexImage3DMultisample");
            glad_glWaitSync = (PFNGLWAITSYNCPROC)glfwGetProcAddress("glWaitSync");
          }
          if (GLAD_GL_VERSION_3_3 != 0) {
            glad_glBindFragDataLocationIndexed =
                 (PFNGLBINDFRAGDATALOCATIONINDEXEDPROC)
                 glfwGetProcAddress("glBindFragDataLocationIndexed");
            glad_glBindSampler = (PFNGLBINDSAMPLERPROC)glfwGetProcAddress("glBindSampler");
            glad_glColorP3ui = (PFNGLCOLORP3UIPROC)glfwGetProcAddress("glColorP3ui");
            glad_glColorP3uiv = (PFNGLCOLORP3UIVPROC)glfwGetProcAddress("glColorP3uiv");
            glad_glColorP4ui = (PFNGLCOLORP4UIPROC)glfwGetProcAddress("glColorP4ui");
            glad_glColorP4uiv = (PFNGLCOLORP4UIVPROC)glfwGetProcAddress("glColorP4uiv");
            glad_glDeleteSamplers = (PFNGLDELETESAMPLERSPROC)glfwGetProcAddress("glDeleteSamplers");
            glad_glGenSamplers = (PFNGLGENSAMPLERSPROC)glfwGetProcAddress("glGenSamplers");
            glad_glGetFragDataIndex =
                 (PFNGLGETFRAGDATAINDEXPROC)glfwGetProcAddress("glGetFragDataIndex");
            glad_glGetQueryObjecti64v =
                 (PFNGLGETQUERYOBJECTI64VPROC)glfwGetProcAddress("glGetQueryObjecti64v");
            glad_glGetQueryObjectui64v =
                 (PFNGLGETQUERYOBJECTUI64VPROC)glfwGetProcAddress("glGetQueryObjectui64v");
            glad_glGetSamplerParameterIiv =
                 (PFNGLGETSAMPLERPARAMETERIIVPROC)glfwGetProcAddress("glGetSamplerParameterIiv");
            glad_glGetSamplerParameterIuiv =
                 (PFNGLGETSAMPLERPARAMETERIUIVPROC)glfwGetProcAddress("glGetSamplerParameterIuiv");
            glad_glGetSamplerParameterfv =
                 (PFNGLGETSAMPLERPARAMETERFVPROC)glfwGetProcAddress("glGetSamplerParameterfv");
            glad_glGetSamplerParameteriv =
                 (PFNGLGETSAMPLERPARAMETERIVPROC)glfwGetProcAddress("glGetSamplerParameteriv");
            glad_glIsSampler = (PFNGLISSAMPLERPROC)glfwGetProcAddress("glIsSampler");
            glad_glMultiTexCoordP1ui =
                 (PFNGLMULTITEXCOORDP1UIPROC)glfwGetProcAddress("glMultiTexCoordP1ui");
            glad_glMultiTexCoordP1uiv =
                 (PFNGLMULTITEXCOORDP1UIVPROC)glfwGetProcAddress("glMultiTexCoordP1uiv");
            glad_glMultiTexCoordP2ui =
                 (PFNGLMULTITEXCOORDP2UIPROC)glfwGetProcAddress("glMultiTexCoordP2ui");
            glad_glMultiTexCoordP2uiv =
                 (PFNGLMULTITEXCOORDP2UIVPROC)glfwGetProcAddress("glMultiTexCoordP2uiv");
            glad_glMultiTexCoordP3ui =
                 (PFNGLMULTITEXCOORDP3UIPROC)glfwGetProcAddress("glMultiTexCoordP3ui");
            glad_glMultiTexCoordP3uiv =
                 (PFNGLMULTITEXCOORDP3UIVPROC)glfwGetProcAddress("glMultiTexCoordP3uiv");
            glad_glMultiTexCoordP4ui =
                 (PFNGLMULTITEXCOORDP4UIPROC)glfwGetProcAddress("glMultiTexCoordP4ui");
            glad_glMultiTexCoordP4uiv =
                 (PFNGLMULTITEXCOORDP4UIVPROC)glfwGetProcAddress("glMultiTexCoordP4uiv");
            glad_glNormalP3ui = (PFNGLNORMALP3UIPROC)glfwGetProcAddress("glNormalP3ui");
            glad_glNormalP3uiv = (PFNGLNORMALP3UIVPROC)glfwGetProcAddress("glNormalP3uiv");
            glad_glQueryCounter = (PFNGLQUERYCOUNTERPROC)glfwGetProcAddress("glQueryCounter");
            glad_glSamplerParameterIiv =
                 (PFNGLSAMPLERPARAMETERIIVPROC)glfwGetProcAddress("glSamplerParameterIiv");
            glad_glSamplerParameterIuiv =
                 (PFNGLSAMPLERPARAMETERIUIVPROC)glfwGetProcAddress("glSamplerParameterIuiv");
            glad_glSamplerParameterf =
                 (PFNGLSAMPLERPARAMETERFPROC)glfwGetProcAddress("glSamplerParameterf");
            glad_glSamplerParameterfv =
                 (PFNGLSAMPLERPARAMETERFVPROC)glfwGetProcAddress("glSamplerParameterfv");
            glad_glSamplerParameteri =
                 (PFNGLSAMPLERPARAMETERIPROC)glfwGetProcAddress("glSamplerParameteri");
            glad_glSamplerParameteriv =
                 (PFNGLSAMPLERPARAMETERIVPROC)glfwGetProcAddress("glSamplerParameteriv");
            glad_glSecondaryColorP3ui =
                 (PFNGLSECONDARYCOLORP3UIPROC)glfwGetProcAddress("glSecondaryColorP3ui");
            glad_glSecondaryColorP3uiv =
                 (PFNGLSECONDARYCOLORP3UIVPROC)glfwGetProcAddress("glSecondaryColorP3uiv");
            glad_glTexCoordP1ui = (PFNGLTEXCOORDP1UIPROC)glfwGetProcAddress("glTexCoordP1ui");
            glad_glTexCoordP1uiv = (PFNGLTEXCOORDP1UIVPROC)glfwGetProcAddress("glTexCoordP1uiv");
            glad_glTexCoordP2ui = (PFNGLTEXCOORDP2UIPROC)glfwGetProcAddress("glTexCoordP2ui");
            glad_glTexCoordP2uiv = (PFNGLTEXCOORDP2UIVPROC)glfwGetProcAddress("glTexCoordP2uiv");
            glad_glTexCoordP3ui = (PFNGLTEXCOORDP3UIPROC)glfwGetProcAddress("glTexCoordP3ui");
            glad_glTexCoordP3uiv = (PFNGLTEXCOORDP3UIVPROC)glfwGetProcAddress("glTexCoordP3uiv");
            glad_glTexCoordP4ui = (PFNGLTEXCOORDP4UIPROC)glfwGetProcAddress("glTexCoordP4ui");
            glad_glTexCoordP4uiv = (PFNGLTEXCOORDP4UIVPROC)glfwGetProcAddress("glTexCoordP4uiv");
            glad_glVertexAttribDivisor =
                 (PFNGLVERTEXATTRIBDIVISORPROC)glfwGetProcAddress("glVertexAttribDivisor");
            glad_glVertexAttribP1ui =
                 (PFNGLVERTEXATTRIBP1UIPROC)glfwGetProcAddress("glVertexAttribP1ui");
            glad_glVertexAttribP1uiv =
                 (PFNGLVERTEXATTRIBP1UIVPROC)glfwGetProcAddress("glVertexAttribP1uiv");
            glad_glVertexAttribP2ui =
                 (PFNGLVERTEXATTRIBP2UIPROC)glfwGetProcAddress("glVertexAttribP2ui");
            glad_glVertexAttribP2uiv =
                 (PFNGLVERTEXATTRIBP2UIVPROC)glfwGetProcAddress("glVertexAttribP2uiv");
            glad_glVertexAttribP3ui =
                 (PFNGLVERTEXATTRIBP3UIPROC)glfwGetProcAddress("glVertexAttribP3ui");
            glad_glVertexAttribP3uiv =
                 (PFNGLVERTEXATTRIBP3UIVPROC)glfwGetProcAddress("glVertexAttribP3uiv");
            glad_glVertexAttribP4ui =
                 (PFNGLVERTEXATTRIBP4UIPROC)glfwGetProcAddress("glVertexAttribP4ui");
            glad_glVertexAttribP4uiv =
                 (PFNGLVERTEXATTRIBP4UIVPROC)glfwGetProcAddress("glVertexAttribP4uiv");
            glad_glVertexP2ui = (PFNGLVERTEXP2UIPROC)glfwGetProcAddress("glVertexP2ui");
            glad_glVertexP2uiv = (PFNGLVERTEXP2UIVPROC)glfwGetProcAddress("glVertexP2uiv");
            glad_glVertexP3ui = (PFNGLVERTEXP3UIPROC)glfwGetProcAddress("glVertexP3ui");
            glad_glVertexP3uiv = (PFNGLVERTEXP3UIVPROC)glfwGetProcAddress("glVertexP3uiv");
            glad_glVertexP4ui = (PFNGLVERTEXP4UIPROC)glfwGetProcAddress("glVertexP4ui");
            glad_glVertexP4uiv = (PFNGLVERTEXP4UIVPROC)glfwGetProcAddress("glVertexP4uiv");
          }
          if (iVar2 < 30000) {
            if (glad_glGetString != (PFNGLGETSTRINGPROC)0x0) {
              pGVar5 = (*glad_glGetString)(0x1f03);
              uVar9 = 0;
              exts_i = (char **)0x0;
LAB_001112b1:
              uVar11 = (uint)uVar9;
              iVar3 = glad_gl_has_extension(iVar2,(char *)pGVar5,uVar11,exts_i,"GL_ARB_multisample")
              ;
              GLAD_GL_ARB_multisample = iVar3;
              GLAD_GL_ARB_robustness =
                   glad_gl_has_extension(iVar2,(char *)pGVar5,uVar11,exts_i,"GL_ARB_robustness");
              GLAD_GL_KHR_debug =
                   glad_gl_has_extension(iVar2,(char *)pGVar5,uVar11,exts_i,"GL_KHR_debug");
              if (exts_i != (char **)0x0) {
                if (uVar11 != 0) {
                  uVar13 = 0;
                  do {
                    free(exts_i[uVar13]);
                    uVar13 = uVar13 + 1;
                    iVar3 = GLAD_GL_ARB_multisample;
                  } while (uVar9 != uVar13);
                }
                free(exts_i);
              }
              if (iVar3 != 0) {
                glad_glSampleCoverageARB =
                     (PFNGLSAMPLECOVERAGEARBPROC)glfwGetProcAddress("glSampleCoverageARB");
              }
              uVar13 = local_50;
              if (GLAD_GL_ARB_robustness != 0) {
                glad_glGetGraphicsResetStatusARB =
                     (PFNGLGETGRAPHICSRESETSTATUSARBPROC)
                     glfwGetProcAddress("glGetGraphicsResetStatusARB");
                glad_glGetnColorTableARB =
                     (PFNGLGETNCOLORTABLEARBPROC)glfwGetProcAddress("glGetnColorTableARB");
                glad_glGetnCompressedTexImageARB =
                     (PFNGLGETNCOMPRESSEDTEXIMAGEARBPROC)
                     glfwGetProcAddress("glGetnCompressedTexImageARB");
                glad_glGetnConvolutionFilterARB =
                     (PFNGLGETNCONVOLUTIONFILTERARBPROC)
                     glfwGetProcAddress("glGetnConvolutionFilterARB");
                glad_glGetnHistogramARB =
                     (PFNGLGETNHISTOGRAMARBPROC)glfwGetProcAddress("glGetnHistogramARB");
                glad_glGetnMapdvARB = (PFNGLGETNMAPDVARBPROC)glfwGetProcAddress("glGetnMapdvARB");
                glad_glGetnMapfvARB = (PFNGLGETNMAPFVARBPROC)glfwGetProcAddress("glGetnMapfvARB");
                glad_glGetnMapivARB = (PFNGLGETNMAPIVARBPROC)glfwGetProcAddress("glGetnMapivARB");
                glad_glGetnMinmaxARB = (PFNGLGETNMINMAXARBPROC)glfwGetProcAddress("glGetnMinmaxARB")
                ;
                glad_glGetnPixelMapfvARB =
                     (PFNGLGETNPIXELMAPFVARBPROC)glfwGetProcAddress("glGetnPixelMapfvARB");
                glad_glGetnPixelMapuivARB =
                     (PFNGLGETNPIXELMAPUIVARBPROC)glfwGetProcAddress("glGetnPixelMapuivARB");
                glad_glGetnPixelMapusvARB =
                     (PFNGLGETNPIXELMAPUSVARBPROC)glfwGetProcAddress("glGetnPixelMapusvARB");
                glad_glGetnPolygonStippleARB =
                     (PFNGLGETNPOLYGONSTIPPLEARBPROC)glfwGetProcAddress("glGetnPolygonStippleARB");
                glad_glGetnSeparableFilterARB =
                     (PFNGLGETNSEPARABLEFILTERARBPROC)glfwGetProcAddress("glGetnSeparableFilterARB")
                ;
                glad_glGetnTexImageARB =
                     (PFNGLGETNTEXIMAGEARBPROC)glfwGetProcAddress("glGetnTexImageARB");
                glad_glGetnUniformdvARB =
                     (PFNGLGETNUNIFORMDVARBPROC)glfwGetProcAddress("glGetnUniformdvARB");
                glad_glGetnUniformfvARB =
                     (PFNGLGETNUNIFORMFVARBPROC)glfwGetProcAddress("glGetnUniformfvARB");
                glad_glGetnUniformivARB =
                     (PFNGLGETNUNIFORMIVARBPROC)glfwGetProcAddress("glGetnUniformivARB");
                glad_glGetnUniformuivARB =
                     (PFNGLGETNUNIFORMUIVARBPROC)glfwGetProcAddress("glGetnUniformuivARB");
                glad_glReadnPixelsARB =
                     (PFNGLREADNPIXELSARBPROC)glfwGetProcAddress("glReadnPixelsARB");
              }
              if (GLAD_GL_KHR_debug != 0) {
                glad_glDebugMessageCallback =
                     (PFNGLDEBUGMESSAGECALLBACKPROC)glfwGetProcAddress("glDebugMessageCallback");
                glad_glDebugMessageControl =
                     (PFNGLDEBUGMESSAGECONTROLPROC)glfwGetProcAddress("glDebugMessageControl");
                glad_glDebugMessageInsert =
                     (PFNGLDEBUGMESSAGEINSERTPROC)glfwGetProcAddress("glDebugMessageInsert");
                glad_glGetDebugMessageLog =
                     (PFNGLGETDEBUGMESSAGELOGPROC)glfwGetProcAddress("glGetDebugMessageLog");
                glad_glGetObjectLabel =
                     (PFNGLGETOBJECTLABELPROC)glfwGetProcAddress("glGetObjectLabel");
                glad_glGetObjectPtrLabel =
                     (PFNGLGETOBJECTPTRLABELPROC)glfwGetProcAddress("glGetObjectPtrLabel");
                glad_glGetPointerv = (PFNGLGETPOINTERVPROC)glfwGetProcAddress("glGetPointerv");
                glad_glObjectLabel = (PFNGLOBJECTLABELPROC)glfwGetProcAddress("glObjectLabel");
                glad_glObjectPtrLabel =
                     (PFNGLOBJECTPTRLABELPROC)glfwGetProcAddress("glObjectPtrLabel");
                glad_glPopDebugGroup = glfwGetProcAddress("glPopDebugGroup");
                glad_glPushDebugGroup =
                     (PFNGLPUSHDEBUGGROUPPROC)glfwGetProcAddress("glPushDebugGroup");
              }
            }
          }
          else {
            local_84 = 0;
            if (glad_glGetIntegerv != (PFNGLGETINTEGERVPROC)0x0 &&
                glad_glGetStringi != (PFNGLGETSTRINGIPROC)0x0) {
              (*glad_glGetIntegerv)(0x821d,(GLint *)&local_84);
              if (((ulong)local_84 != 0) &&
                 (exts_i = (char **)malloc((ulong)local_84 << 3), exts_i != (char **)0x0)) {
                uVar13 = 0;
                local_78 = handle;
                do {
                  pGVar5 = (*glad_glGetStringi)(0x1f03,(GLuint)uVar13);
                  sVar6 = strlen((char *)pGVar5);
                  pcVar4 = (char *)malloc(sVar6 + 1);
                  if (pcVar4 != (char *)0x0) {
                    memcpy(pcVar4,pGVar5,sVar6 + 1);
                  }
                  exts_i[uVar13] = pcVar4;
                  uVar13 = uVar13 + 1;
                  uVar9 = (ulong)local_84;
                } while (uVar13 < uVar9);
                pGVar5 = (GLubyte *)0x0;
                handle = local_78;
                goto LAB_001112b1;
              }
            }
          }
        }
        glfwSwapInterval(1);
        glfwSetTime(0.0);
        pGVar1 = local_38;
        while (dVar15 = glfwGetTime(), dVar15 < 5.0) {
          (*glad_glClear)(0x4000);
          glfwSwapBuffers(handle);
          glfwPollEvents();
          iVar2 = glfwWindowShouldClose(handle);
          if (iVar2 != 0) {
            puts("User terminated program");
            glfwTerminate();
            exit(0);
          }
        }
        (*glad_glGetIntegerv)(0xd52,(GLint *)&local_60);
        (*glad_glGetIntegerv)(0xd53,(GLint *)&local_5c);
        (*glad_glGetIntegerv)(0xd54,(GLint *)local_58);
        glfwGetWindowSize(handle,&local_68,&local_64);
        if (local_60 == pGVar1->redBits) {
          uVar9 = (ulong)(uint)pGVar1->greenBits;
          uVar11 = pGVar1->blueBits;
          if ((local_5c != pGVar1->greenBits) || (uVar9 = (ulong)local_5c, local_58[0] != uVar11))
          goto LAB_0011168d;
        }
        else {
          uVar9 = (ulong)(uint)pGVar1->greenBits;
          uVar11 = pGVar1->blueBits;
LAB_0011168d:
          printf("*** Color bit mismatch: (%i %i %i) instead of (%i %i %i)\n",(ulong)local_60,
                 (ulong)local_5c,(ulong)local_58[0],(ulong)(uint)pGVar1->redBits,uVar9,uVar11);
        }
        if (local_64 != pGVar1->height || local_68 != pGVar1->width) {
          printf("*** Size mismatch: %ix%i instead of %ix%i\n");
        }
        puts("Closing window");
        glfwDestroyWindow(handle);
        glfwPollEvents();
      }
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 < (long)local_6c);
  }
  return;
}

Assistant:

static void test_modes(GLFWmonitor* monitor)
{
    int i, count;
    GLFWwindow* window;
    const GLFWvidmode* modes = glfwGetVideoModes(monitor, &count);

    for (i = 0;  i < count;  i++)
    {
        const GLFWvidmode* mode = modes + i;
        GLFWvidmode current;

        glfwWindowHint(GLFW_RED_BITS, mode->redBits);
        glfwWindowHint(GLFW_GREEN_BITS, mode->greenBits);
        glfwWindowHint(GLFW_BLUE_BITS, mode->blueBits);
        glfwWindowHint(GLFW_REFRESH_RATE, mode->refreshRate);

        printf("Testing mode %u on monitor %s: %s\n",
               (unsigned int) i,
               glfwGetMonitorName(monitor),
               format_mode(mode));

        window = glfwCreateWindow(mode->width, mode->height,
                                  "Video Mode Test",
                                  glfwGetPrimaryMonitor(),
                                  NULL);
        if (!window)
        {
            printf("Failed to enter mode %u: %s\n",
                   (unsigned int) i,
                   format_mode(mode));
            continue;
        }

        glfwSetFramebufferSizeCallback(window, framebuffer_size_callback);
        glfwSetKeyCallback(window, key_callback);

        glfwMakeContextCurrent(window);
        gladLoadGL(glfwGetProcAddress);
        glfwSwapInterval(1);

        glfwSetTime(0.0);

        while (glfwGetTime() < 5.0)
        {
            glClear(GL_COLOR_BUFFER_BIT);
            glfwSwapBuffers(window);
            glfwPollEvents();

            if (glfwWindowShouldClose(window))
            {
                printf("User terminated program\n");

                glfwTerminate();
                exit(EXIT_SUCCESS);
            }
        }

        glGetIntegerv(GL_RED_BITS, &current.redBits);
        glGetIntegerv(GL_GREEN_BITS, &current.greenBits);
        glGetIntegerv(GL_BLUE_BITS, &current.blueBits);

        glfwGetWindowSize(window, &current.width, &current.height);

        if (current.redBits != mode->redBits ||
            current.greenBits != mode->greenBits ||
            current.blueBits != mode->blueBits)
        {
            printf("*** Color bit mismatch: (%i %i %i) instead of (%i %i %i)\n",
                   current.redBits, current.greenBits, current.blueBits,
                   mode->redBits, mode->greenBits, mode->blueBits);
        }

        if (current.width != mode->width || current.height != mode->height)
        {
            printf("*** Size mismatch: %ix%i instead of %ix%i\n",
                   current.width, current.height,
                   mode->width, mode->height);
        }

        printf("Closing window\n");

        glfwDestroyWindow(window);
        window = NULL;

        glfwPollEvents();
    }
}